

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O2

void __thiscall Spaghetti<UFPC>::PerformLabeling(Spaghetti<UFPC> *this)

{
  undefined8 uVar1;
  char cVar2;
  uint uVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  ulong local_128;
  long local_f8;
  int local_b0;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar17 = *(uint *)&pMVar4->field_0x8;
  uVar3 = *(uint *)&pMVar4->field_0xc;
  uVar20 = (ulong)(int)uVar3;
  local_98.height = (int)**(undefined8 **)&pMVar4->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar4->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  puVar6 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar34 = *(long *)&pMVar4->field_0x10;
  if (uVar17 == 1) {
    lVar13 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar35 = 0xfffffffffffffffe;
LAB_00136e22:
    do {
      lVar32 = (long)(int)uVar35;
      uVar35 = lVar32 + 2;
      iVar29 = (int)(uVar20 - 2);
      if (iVar29 <= (int)uVar35) {
        if (iVar29 < (int)uVar35) {
          if (*(char *)(lVar34 + uVar35) == '\0') {
            *(undefined4 *)(lVar13 + 8 + lVar32 * 4) = 0;
          }
          else {
            puVar6[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar13 + 8 + lVar32 * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
          }
        }
        else if (*(char *)(lVar34 + uVar35) == '\0') {
LAB_00137261:
          if (*(char *)(lVar34 + 1 + uVar35) == '\0') {
            *(undefined4 *)(lVar13 + uVar35 * 4) = 0;
          }
          else {
            puVar6[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar13 + uVar35 * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
          }
        }
        else {
          puVar6[UFPC::length_] = UFPC::length_;
          uVar9 = UFPC::length_ + 1;
          *(uint *)(lVar13 + 8 + lVar32 * 4) = UFPC::length_;
          UFPC::length_ = uVar9;
        }
LAB_0013b085:
        uVar9 = UFPC::Flatten();
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
        puVar6 = UFPC::P_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        local_b0 = (int)((long)(int)uVar17 & 0xfffffffffffffffeU);
        lVar34 = 1;
        for (lVar13 = 0; puVar7 = UFPC::P_, lVar13 < local_b0; lVar13 = lVar13 + 2) {
          lVar32 = **(long **)&pMVar5->field_0x48;
          lVar40 = lVar32 * lVar13 + *(long *)&pMVar5->field_0x10;
          lVar37 = lVar32 * lVar34 + *(long *)&pMVar5->field_0x10;
          lVar46 = **(long **)&pMVar4->field_0x48 * lVar34 + *(long *)&pMVar4->field_0x10;
          lVar22 = **(long **)&pMVar4->field_0x48 * lVar13 + *(long *)&pMVar4->field_0x10;
          for (uVar35 = 0; (long)uVar35 < (long)(uVar20 & 0xfffffffffffffffe); uVar35 = uVar35 + 2)
          {
            lVar28 = (long)*(int *)(lVar40 + uVar35 * 4);
            if (lVar28 < 1) {
              *(undefined8 *)(lVar40 + uVar35 * 4) = 0;
              uVar48 = uVar35 | 1;
              *(undefined4 *)(lVar37 + uVar35 * 4) = 0;
              uVar9 = 0;
            }
            else {
              uVar9 = puVar7[lVar28];
              uVar8 = uVar9;
              if (*(char *)(lVar22 + uVar35) == '\0') {
                uVar8 = 0;
              }
              *(uint *)(lVar40 + uVar35 * 4) = uVar8;
              uVar8 = uVar9;
              if (*(char *)(lVar22 + 1 + uVar35) == '\0') {
                uVar8 = 0;
              }
              uVar48 = uVar35 + 1;
              *(uint *)(lVar40 + 4 + uVar35 * 4) = uVar8;
              uVar8 = uVar9;
              if (*(char *)(lVar46 + uVar35) == '\0') {
                uVar8 = 0;
              }
              *(uint *)(lVar37 + uVar35 * 4) = uVar8;
              if (*(char *)(lVar46 + 1 + uVar35) == '\0') {
                uVar9 = 0;
              }
            }
            *(uint *)(lVar40 + lVar32 + uVar48 * 4) = uVar9;
          }
          if ((uVar3 & 0x80000001) == 1) {
            lVar32 = (long)*(int *)(lVar40 + uVar35 * 4);
            if (lVar32 < 1) {
              *(undefined4 *)(lVar40 + uVar35 * 4) = 0;
              *(undefined4 *)(lVar37 + uVar35 * 4) = 0;
            }
            else {
              uVar9 = puVar6[lVar32];
              uVar8 = uVar9;
              if (*(char *)(uVar35 + lVar22) == '\0') {
                uVar8 = 0;
              }
              *(uint *)(lVar40 + uVar35 * 4) = uVar8;
              if (*(char *)(uVar35 + lVar46) == '\0') {
                *(undefined4 *)(lVar37 + uVar35 * 4) = 0;
              }
              else {
                *(uint *)(lVar37 + uVar35 * 4) = uVar9;
              }
            }
          }
          lVar34 = lVar34 + 2;
        }
        if ((uVar17 & 0x80000001) == 1) {
          lVar32 = **(long **)&pMVar4->field_0x48 * lVar13 + *(long *)&pMVar4->field_0x10;
          lVar34 = lVar13 * **(long **)&pMVar5->field_0x48 + *(long *)&pMVar5->field_0x10;
          for (lVar13 = 0; lVar13 < (long)(uVar20 & 0xfffffffffffffffe); lVar13 = lVar13 + 2) {
            lVar22 = (long)*(int *)(lVar34 + lVar13 * 4);
            if (lVar22 < 1) {
              *(undefined8 *)(lVar34 + lVar13 * 4) = 0;
            }
            else {
              uVar17 = puVar7[lVar22];
              uVar9 = uVar17;
              if (*(char *)(lVar32 + lVar13) == '\0') {
                uVar9 = 0;
              }
              *(uint *)(lVar34 + lVar13 * 4) = uVar9;
              if (*(char *)(lVar32 + 1 + lVar13) == '\0') {
                *(undefined4 *)(lVar34 + 4 + lVar13 * 4) = 0;
              }
              else {
                *(uint *)(lVar34 + 4 + lVar13 * 4) = uVar17;
              }
            }
          }
          if ((uVar3 & 0x80000001) == 1) {
            lVar22 = (long)*(int *)(lVar34 + lVar13 * 4);
            uVar17 = 0;
            if ((0 < lVar22) && (uVar17 = 0, *(char *)(lVar13 + lVar32) != '\0')) {
              uVar17 = UFPC::P_[lVar22];
            }
            *(uint *)(lVar34 + lVar13 * 4) = uVar17;
          }
        }
        UFPC::Dealloc();
        return;
      }
      if (*(char *)(lVar34 + uVar35) == '\0') goto LAB_00136e54;
      cVar2 = *(char *)(lVar34 + 3 + lVar32);
      puVar6[UFPC::length_] = UFPC::length_;
      uVar9 = UFPC::length_ + 1;
      *(uint *)(lVar13 + 8 + lVar32 * 4) = UFPC::length_;
      UFPC::length_ = uVar9;
      uVar48 = uVar35;
    } while (cVar2 == '\0');
    do {
      uVar33 = uVar48 + 2;
      if ((long)(uVar20 - 2) <= (long)uVar33) {
        uVar35 = (ulong)(int)uVar33;
        if (iVar29 < (int)uVar33) {
          if (*(char *)(lVar34 + uVar35) == '\0') {
            *(undefined4 *)(lVar13 + uVar35 * 4) = 0;
            goto LAB_0013b085;
          }
        }
        else if (*(char *)(lVar34 + uVar35) == '\0') goto LAB_00137261;
        *(undefined4 *)(lVar13 + uVar35 * 4) = *(undefined4 *)(lVar13 + (long)(int)uVar48 * 4);
        goto LAB_0013b085;
      }
      if (*(char *)(lVar34 + uVar33) == '\0') {
        uVar35 = uVar33 & 0xffffffff;
LAB_00136e54:
        uVar33 = (ulong)(int)uVar35;
        if (*(char *)(lVar34 + 1 + uVar33) == '\0') {
          uVar14 = 0;
          goto LAB_00136ead;
        }
        puVar6[UFPC::length_] = UFPC::length_;
        uVar48 = uVar33;
        uVar9 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      else {
        if (*(char *)(lVar34 + 3 + uVar48) == '\0') goto LAB_00136ea6;
        lVar32 = uVar48 * 4;
        uVar48 = uVar33;
        uVar9 = *(uint *)(lVar13 + lVar32);
      }
      *(uint *)(lVar13 + uVar48 * 4) = uVar9;
    } while( true );
  }
  local_f8 = 1;
  uVar35 = 0xfffffffffffffffe;
  lVar22 = **(long **)&pMVar4->field_0x48;
  lVar32 = lVar34 + lVar22;
  lVar37 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar13 = uVar20 - 2;
  lVar22 = lVar34 + 2 + lVar22;
  while( true ) {
    lVar40 = (long)(int)uVar35;
    uVar35 = lVar40 + 2;
    iVar29 = (int)lVar13;
    if (iVar29 <= (int)uVar35) break;
    if (*(char *)(lVar34 + uVar35) == '\0') {
      uVar48 = uVar35 & 0xffffffff;
      if (*(char *)(lVar32 + uVar35) == '\0') goto LAB_00136f2c;
    }
    else {
      uVar48 = uVar35 & 0xffffffff;
    }
LAB_00137098:
    cVar2 = *(char *)(lVar34 + 1 + uVar35);
    puVar6[UFPC::length_] = UFPC::length_;
    uVar9 = UFPC::length_ + 1;
    *(uint *)(lVar37 + uVar35 * 4) = UFPC::length_;
    UFPC::length_ = uVar9;
    if (cVar2 != '\0') goto LAB_00136f71;
LAB_00136fa5:
    iVar30 = (int)uVar48;
    lVar44 = (long)iVar30;
    lVar40 = lVar37 + lVar44 * 4;
    lVar46 = lVar22 + lVar44;
    lVar31 = lVar44 << 0x20;
    lVar28 = lVar34 + 2 + lVar44;
    lVar38 = 0;
    while( true ) {
      lVar18 = lVar31 >> 0x20;
      if (lVar13 <= lVar38 + lVar44 + 2) {
        uVar48 = (ulong)(iVar30 + 2) + lVar38;
        uVar35 = lVar31 + 0x200000000 >> 0x20;
        if (iVar29 < (int)uVar48) {
          if ((*(char *)(lVar34 + uVar35) == '\0') && (*(char *)(lVar32 + uVar35) == '\0')) {
            *(undefined4 *)(lVar37 + uVar35 * 4) = 0;
            goto LAB_00137324;
          }
        }
        else {
          if (*(char *)(lVar34 + uVar35) != '\0') {
            if (*(char *)(lVar32 + 1 + lVar18) != '\0') goto LAB_001372a8;
            goto LAB_0013730b;
          }
          if (*(char *)(lVar32 + uVar35) == '\0') {
            uVar35 = uVar48 & 0xffffffff;
            goto LAB_001372b9;
          }
        }
        lVar34 = lVar31 + 0x200000000 >> 0x1e;
        if (*(char *)(lVar32 + 1 + lVar18) == '\0') {
          puVar6[UFPC::length_] = UFPC::length_;
          uVar9 = UFPC::length_ + 1;
          *(uint *)(lVar37 + lVar34) = UFPC::length_;
          UFPC::length_ = uVar9;
        }
        else {
          *(undefined4 *)(lVar37 + lVar34) = *(undefined4 *)(lVar37 + lVar18 * 4);
        }
        goto LAB_00137324;
      }
      if (*(char *)(lVar28 + lVar38) != '\0') {
        uVar48 = (ulong)(iVar30 + 2) + lVar38;
        if (*(char *)(lVar32 + 1 + lVar18) != '\0') {
          uVar35 = uVar48 & 0xffffffff;
          goto LAB_00136f8e;
        }
        uVar35 = lVar31 + 0x200000000 >> 0x20;
        goto LAB_00137098;
      }
      if (*(char *)(lVar46 + lVar38) == '\0') {
        uVar35 = (ulong)(iVar30 + (int)lVar38 + 2);
        goto LAB_00136f2c;
      }
      if (*(char *)(lVar28 + 1 + lVar38) != '\0') break;
      if (*(char *)(lVar46 + -1 + lVar38) == '\0') {
        puVar6[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
      }
      else {
        uVar9 = *(uint *)(lVar40 + lVar38 * 4);
      }
      *(uint *)(lVar40 + 8 + lVar38 * 4) = uVar9;
      lVar38 = lVar38 + 2;
      lVar31 = lVar31 + 0x200000000;
    }
    lVar46 = lVar44 + 2 + lVar38;
    if (*(char *)(lVar22 + -1 + lVar44 + lVar38) == '\0') {
      uVar48 = (ulong)UFPC::length_;
      puVar6[uVar48] = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
    }
    else {
      uVar48 = (ulong)*(uint *)(lVar40 + lVar38 * 4);
    }
    uVar35 = (ulong)(iVar30 + 2) + lVar38 & 0xffffffff;
    while( true ) {
      *(int *)(lVar37 + lVar46 * 4) = (int)uVar48;
      uVar48 = uVar35 & 0xffffffff;
LAB_00136f71:
      while( true ) {
        lVar40 = (long)(int)uVar48;
        uVar35 = lVar40 + 2;
        if (iVar29 <= (int)uVar35) {
          if ((int)uVar35 <= iVar29) {
            if ((*(char *)(lVar34 + uVar35) != '\0') || (*(char *)(lVar32 + uVar35) != '\0'))
            goto LAB_001372a8;
            goto LAB_001372b9;
          }
          if ((*(char *)(lVar34 + uVar35) == '\0') && (*(char *)(lVar32 + uVar35) == '\0'))
          goto LAB_0013afa4;
          *(undefined4 *)(lVar37 + 8 + lVar40 * 4) = *(undefined4 *)(lVar37 + lVar40 * 4);
          goto LAB_00137324;
        }
        if ((*(char *)(lVar34 + uVar35) == '\0') && (*(char *)(lVar32 + uVar35) == '\0')) break;
LAB_00136f8e:
        lVar40 = (long)(int)uVar35;
        cVar2 = *(char *)(lVar34 + 1 + lVar40);
        *(undefined4 *)(lVar37 + lVar40 * 4) = *(undefined4 *)(lVar37 + -8 + lVar40 * 4);
        uVar48 = uVar35 & 0xffffffff;
        if (cVar2 == '\0') goto LAB_00136fa5;
      }
LAB_00136f2c:
      lVar46 = (long)(int)uVar35;
      if ((*(char *)(lVar46 + 1 + lVar34) == '\0') && (*(char *)(lVar32 + 1 + lVar46) == '\0'))
      break;
      uVar48 = (ulong)UFPC::length_;
      puVar6[uVar48] = UFPC::length_;
      UFPC::length_ = UFPC::length_ + 1;
    }
    *(undefined4 *)(lVar37 + (long)(int)uVar35 * 4) = 0;
  }
  if (iVar29 < (int)uVar35) {
    if ((*(char *)(lVar34 + uVar35) == '\0') && (*(char *)(lVar32 + uVar35) == '\0')) {
LAB_0013afa4:
      *(undefined4 *)(lVar37 + 8 + lVar40 * 4) = 0;
    }
    else {
      puVar6[UFPC::length_] = UFPC::length_;
      uVar9 = UFPC::length_ + 1;
      *(uint *)(lVar37 + 8 + lVar40 * 4) = UFPC::length_;
      UFPC::length_ = uVar9;
    }
  }
  else {
    if ((*(char *)(lVar34 + uVar35) == '\0') && (*(char *)(lVar32 + uVar35) == '\0')) {
LAB_001372b9:
      uVar35 = (ulong)(int)uVar35;
      if ((*(char *)(uVar35 + 1 + lVar34) == '\0') && (*(char *)(lVar32 + 1 + uVar35) == '\0')) {
        *(undefined4 *)(lVar37 + uVar35 * 4) = 0;
        goto LAB_00137324;
      }
    }
LAB_0013730b:
    puVar6[UFPC::length_] = UFPC::length_;
    uVar9 = UFPC::length_ + 1;
    *(uint *)(lVar37 + uVar35 * 4) = UFPC::length_;
    UFPC::length_ = uVar9;
  }
LAB_00137324:
  lVar34 = 2;
  lVar32 = 3;
  lVar22 = 0;
LAB_0013732e:
  if (lVar34 < (long)((long)(int)uVar17 & 0xfffffffffffffffeU)) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar46 = *(long *)&pMVar4->field_0x10;
    lVar28 = **(long **)&pMVar4->field_0x48;
    lVar47 = lVar28 * lVar34;
    lVar37 = lVar46 + lVar47;
    lVar41 = lVar37 - lVar28;
    lVar40 = lVar28 + lVar37;
    lVar31 = *(long *)&pMVar5->field_0x10;
    lVar38 = **(long **)&pMVar5->field_0x48;
    lVar44 = lVar38 * lVar34;
    lVar26 = lVar31 + lVar44;
    lVar18 = lVar26 + lVar38 * -2;
    cVar2 = *(char *)(lVar46 + lVar47);
    if (2 < (int)uVar3) {
      lVar42 = lVar41 - lVar28;
      uVar35 = 0;
      local_128 = 0;
      if (cVar2 == '\0') {
LAB_0013752a:
        lVar10 = (long)(int)uVar35;
        if (*(char *)(lVar40 + lVar10) == '\0') goto LAB_0013755d;
        if (*(char *)(lVar37 + 1 + lVar10) == '\0') goto LAB_00137b9d;
        uVar33 = uVar35 & 0xffffffff;
        goto LAB_00137573;
      }
LAB_00137461:
      uVar35 = local_128;
      lVar10 = (long)(int)uVar35;
      if (*(char *)(lVar10 + 1 + lVar41) == '\0') {
        if (*(char *)(lVar37 + 1 + lVar10) != '\0') goto LAB_0013759a;
        if (*(char *)(lVar41 + lVar10) != '\0') {
          *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
          goto LAB_00138090;
        }
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
        goto LAB_00137929;
      }
      *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
LAB_00139819:
      do {
        iVar30 = (int)uVar35;
        lVar36 = (long)iVar30;
        lVar45 = lVar36 << 0x20;
        lVar10 = lVar46 + lVar47 + lVar36;
        lVar27 = lVar28 * local_f8 + lVar36;
        lVar21 = lVar28 * lVar32 + lVar36;
        lVar12 = lVar44 + lVar36 * 4;
        lVar15 = lVar31 + lVar12 + 8;
        lVar16 = lVar38 * lVar22 + lVar36 * 4;
        lVar39 = lVar31 + lVar16 + 8;
        lVar11 = 0;
LAB_001398a4:
        uVar48 = lVar36 + lVar11 + 2;
        iVar23 = (int)lVar11;
        lVar25 = lVar45 >> 0x1e;
        lVar24 = lVar45 >> 0x20;
        if (lVar13 <= (long)uVar48) {
          uVar35 = (ulong)(iVar30 + 2) + lVar11;
          uVar33 = uVar48 & 0xffffffff;
          iVar43 = (int)uVar35;
          if (iVar29 < iVar43) {
            if (*(char *)(lVar37 + uVar33) == '\0') {
              if (*(char *)(lVar40 + uVar33) != '\0') goto LAB_00139d27;
              *(undefined4 *)(lVar26 + uVar33 * 4) = 0;
            }
            else {
              uVar35 = (ulong)(iVar23 + iVar30 + 1);
              if (*(char *)(lVar37 + uVar35) == '\0') {
                if (*(char *)(lVar40 + uVar35) != '\0') goto LAB_00139e47;
                goto LAB_00139f54;
              }
              uVar14 = *(undefined4 *)(lVar26 + lVar25);
LAB_0013999c:
              *(undefined4 *)(lVar26 + (uVar48 & 0xffffffff) * 4) = uVar14;
            }
            goto LAB_00139212;
          }
          if (*(char *)(lVar37 + uVar33) != '\0') {
            uVar48 = (ulong)(iVar23 + iVar30 + 1);
            if ((*(char *)(lVar37 + uVar48) != '\0') || (*(char *)(lVar40 + uVar48) != '\0'))
            goto LAB_00138fff;
            if (*(char *)(lVar41 + 3 + lVar24) != '\0') {
              if (*(char *)(lVar41 + uVar33) != '\0') goto LAB_00139f5e;
              uVar48 = lVar45 + 0x200000000 >> 0x20;
LAB_00137d5e:
              if (*(char *)(lVar42 + uVar48) == '\0') {
                uVar9 = *(uint *)(lVar18 + -8 + uVar48 * 4);
                uVar8 = *(uint *)(lVar18 + uVar48 * 4);
LAB_0013950d:
                uVar9 = UFPC::Merge(uVar9,uVar8);
                *(uint *)(lVar26 + uVar48 * 4) = uVar9;
                goto LAB_00139212;
              }
              goto LAB_0013929c;
            }
LAB_00139f54:
            if (*(char *)(lVar41 + uVar33) == '\0') {
              uVar14 = *(undefined4 *)(lVar18 + lVar25);
            }
            else {
LAB_00139f5e:
              uVar14 = *(undefined4 *)(lVar18 + uVar33 * 4);
            }
            goto LAB_0013a073;
          }
          if (*(char *)(lVar40 + uVar33) == '\0') {
            uVar48 = uVar35 & 0xffffffff;
            goto LAB_00137764;
          }
          uVar19 = (ulong)(iVar30 + iVar23 + 3);
          if (*(char *)(lVar37 + uVar19) == '\0') {
LAB_00139d27:
            uVar35 = (ulong)(iVar23 + iVar30 + 1);
            if (*(char *)(lVar40 + uVar35) != '\0') {
              uVar14 = *(undefined4 *)(lVar26 + lVar25);
              uVar33 = uVar48 & 0xffffffff;
              goto LAB_0013a073;
            }
            if (*(char *)(lVar37 + uVar35) != '\0') {
              uVar14 = *(undefined4 *)(lVar26 + lVar25);
              goto LAB_0013999c;
            }
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar26 + (uVar48 & 0xffffffff) * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
            goto LAB_00139212;
          }
          uVar48 = (ulong)(iVar23 + iVar30 + 1);
          if (*(char *)(lVar37 + uVar48) != '\0') goto LAB_00138fff;
          if (*(char *)(lVar40 + uVar48) == '\0') goto LAB_001373f7;
          if (*(char *)(lVar41 + uVar19) == '\0') goto LAB_0013a0b3;
          uVar48 = lVar45 + 0x200000000 >> 0x20;
          goto LAB_00139291;
        }
        if (*(char *)(lVar10 + 2 + lVar11) == '\0') {
          uVar35 = (ulong)(iVar30 + 2) + lVar11;
          if (*(char *)(lVar11 + 2 + lVar21 + lVar46) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_0013755d;
          }
          lVar10 = lVar45 + 0x300000000 >> 0x20;
          lVar21 = lVar45 + 0x100000000 >> 0x20;
          if (*(char *)(lVar37 + lVar10) == '\0') {
            if (*(char *)(lVar40 + lVar21) == '\0') {
              if (*(char *)(lVar37 + lVar21) == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar9 = UFPC::length_ + 1;
                *(uint *)(lVar12 + lVar31 + 8 + lVar11 * 4) = UFPC::length_;
                UFPC::length_ = uVar9;
              }
              else {
                *(undefined4 *)(lVar12 + lVar31 + 8 + lVar11 * 4) = *(undefined4 *)(lVar26 + lVar25)
                ;
              }
            }
            else {
              *(undefined4 *)(lVar12 + lVar31 + 8 + lVar11 * 4) = *(undefined4 *)(lVar26 + lVar25);
            }
LAB_0013a001:
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_00137bc5;
          }
          uVar48 = uVar35;
          if (*(char *)(lVar37 + lVar21) != '\0') {
            uVar33 = lVar45 + 0x200000000 >> 0x20;
            goto LAB_00139a37;
          }
          uVar33 = uVar35;
          if (*(char *)(lVar40 + lVar21) == '\0') goto LAB_00137573;
          if (*(char *)(lVar41 + lVar10) != '\0') goto LAB_00139a4a;
          if (*(char *)(lVar41 + 4 + lVar24) != '\0') {
            uVar33 = lVar45 + 0x200000000 >> 0x20;
            local_128 = uVar35 & 0xffffffff;
            goto LAB_001390ca;
          }
          if (*(char *)(lVar11 + 2 + lVar27 + lVar46) == '\0') {
            *(undefined4 *)(lVar15 + lVar11 * 4) = *(undefined4 *)(lVar26 + lVar24 * 4);
            uVar35 = uVar35 & 0xffffffff;
            goto LAB_001381fa;
          }
LAB_00139c91:
          *(undefined4 *)(lVar15 + lVar11 * 4) = *(undefined4 *)(lVar16 + lVar31 + 8 + lVar11 * 4);
          uVar35 = uVar35 & 0xffffffff;
LAB_00138775:
          lVar10 = (long)(int)uVar35;
          uVar35 = lVar10 + 2;
          iVar30 = (int)uVar35;
          if (iVar29 <= iVar30) {
            if (iVar30 <= iVar29) {
              uVar48 = uVar35 & 0xffffffff;
              if (*(char *)(lVar37 + uVar48) != '\0') {
LAB_001387d9:
                if (*(char *)(lVar41 + 3 + lVar10) != '\0') {
                  if (*(char *)(lVar42 + uVar48) == '\0') {
LAB_001387f5:
                    uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar48 * 4),
                                        *(uint *)(lVar26 + lVar10 * 4));
                    *(uint *)(lVar26 + uVar48 * 4) = uVar9;
                  }
                  else {
LAB_00139397:
                    lVar37 = (long)(int)uVar35;
                    uVar9 = *(uint *)(lVar18 + lVar37 * 4);
                    if (*(char *)(lVar42 + -1 + lVar37) == '\0') {
                      uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + lVar37 * 4));
                      *(uint *)(lVar26 + lVar37 * 4) = uVar9;
                    }
                    else {
                      *(uint *)(lVar26 + lVar37 * 4) = uVar9;
                    }
                  }
                  goto LAB_00139212;
                }
LAB_001388e3:
                uVar14 = *(undefined4 *)(lVar26 + lVar10 * 4);
                goto LAB_001392a0;
              }
              if (*(char *)(lVar40 + uVar48) != '\0') {
                if (*(char *)(lVar37 + 3 + lVar10) != '\0') goto LAB_001387d9;
                goto LAB_001388e3;
              }
LAB_00138f68:
              iVar43 = (int)uVar35;
              uVar48 = (ulong)iVar43;
              if (*(char *)(uVar48 + 1 + lVar37) == '\0') goto LAB_0013777a;
              cVar2 = *(char *)(lVar41 + 1 + uVar48);
              goto joined_r0x00138f83;
            }
LAB_00138fc6:
            iVar43 = (int)uVar35;
LAB_00138fd0:
            lVar46 = (long)iVar43;
            if (*(char *)(lVar37 + lVar46) == '\0') {
LAB_00138fd9:
              if (*(char *)(lVar40 + lVar46) != '\0') goto LAB_00138fe0;
              *(undefined4 *)(lVar26 + lVar46 * 4) = 0;
            }
            else {
LAB_00138fe0:
              *(undefined4 *)(lVar26 + lVar46 * 4) = *(undefined4 *)(lVar26 + -8 + lVar46 * 4);
            }
            goto LAB_00139212;
          }
          if (*(char *)(lVar37 + uVar35) == '\0') {
            if (*(char *)(lVar40 + uVar35) == '\0') goto LAB_00138349;
            if (*(char *)(lVar10 + 3 + lVar37) == '\0') {
LAB_001388eb:
              *(undefined4 *)(lVar26 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
              uVar35 = uVar35 & 0xffffffff;
              goto LAB_00137bc5;
            }
            if (*(char *)(lVar41 + 3 + lVar10) != '\0') {
              uVar48 = uVar35;
              if (*(char *)(lVar42 + uVar35) == '\0') {
                uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar10 * 4),
                                    *(uint *)(lVar26 + lVar10 * 4));
                *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
                goto LAB_00138f8e;
              }
LAB_00138d2c:
              uVar9 = *(uint *)(lVar18 + uVar48 * 4);
              if (*(char *)(lVar42 + -1 + uVar48) != '\0') {
                *(uint *)(lVar26 + uVar48 * 4) = uVar9;
                goto LAB_00138f8e;
              }
              uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar48 * 4));
              *(uint *)(lVar26 + uVar48 * 4) = uVar9;
              goto LAB_00138f8e;
            }
LAB_00138891:
            if (*(char *)(lVar10 + 4 + lVar41) == '\0') {
              *(undefined4 *)(lVar26 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
              goto LAB_001389d0;
            }
            if (*(char *)(lVar42 + 3 + lVar10) == '\0') {
              uVar9 = UFPC::Merge(*(uint *)(lVar18 + 0x10 + lVar10 * 4),
                                  *(uint *)(lVar26 + lVar10 * 4));
              *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
              local_128 = uVar35 & 0xffffffff;
              goto LAB_001383cc;
            }
            if (*(char *)(lVar42 + uVar35) == '\0') {
              uVar9 = UFPC::Merge(*(uint *)(lVar18 + 0x10 + lVar10 * 4),
                                  *(uint *)(lVar26 + lVar10 * 4));
              *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
              local_128 = uVar35 & 0xffffffff;
              goto LAB_001383cc;
            }
            local_128 = uVar35 & 0xffffffff;
LAB_00138b2d:
            uVar9 = *(uint *)(lVar18 + 8 + uVar35 * 4);
            if (*(char *)(lVar42 + -1 + uVar35) == '\0') {
              uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar35 * 4));
              *(uint *)(lVar26 + uVar35 * 4) = uVar9;
            }
            else {
              *(uint *)(lVar26 + uVar35 * 4) = uVar9;
            }
LAB_001383cc:
            lVar39 = (long)(int)local_128;
            lVar21 = lVar39 << 0x20;
            lVar10 = lVar44 + lVar39 * 4;
            lVar45 = lVar31 + lVar10 + 8;
            lVar12 = lVar46 + lVar28 * local_f8 + lVar39;
            lVar11 = lVar38 * lVar22 + lVar39 * 4 + lVar31;
            lVar15 = lVar11 + 8;
            lVar16 = lVar46 + lVar47 + lVar39;
            lVar27 = lVar16 + 3;
            lVar36 = 0;
            while( true ) {
              uVar48 = lVar39 + lVar36 + 2;
              lVar24 = lVar21 >> 0x20;
              iVar43 = (int)lVar36;
              if (lVar13 <= (long)uVar48) break;
              lVar25 = lVar21 >> 0x1e;
              if (*(char *)(lVar16 + 2 + lVar36) == '\0') {
                if (*(char *)(lVar28 * lVar32 + lVar39 + lVar46 + 2 + lVar36) == '\0') {
                  uVar35 = (ulong)((int)local_128 + 2) + lVar36;
                  lVar10 = lVar21 + 0x300000000 >> 0x20;
                  if (*(char *)(lVar37 + lVar10) == '\0') goto LAB_00137606;
                  if (*(char *)(lVar41 + lVar10) != '\0') {
                    *(undefined4 *)(lVar45 + lVar36 * 4) = *(undefined4 *)(lVar15 + lVar36 * 4);
                    uVar35 = uVar35 & 0xffffffff;
                    goto LAB_00138f8e;
                  }
                  local_128 = uVar35;
                  if (*(char *)(lVar41 + 4 + lVar24) != '\0') goto LAB_00139ae8;
                  *(undefined4 *)(lVar45 + lVar36 * 4) = *(undefined4 *)(lVar15 + lVar36 * 4);
                  goto LAB_00138775;
                }
                if (*(char *)(lVar27 + lVar36) == '\0') {
                  uVar35 = (ulong)((int)local_128 + iVar43 + 2);
                  *(undefined4 *)(lVar10 + lVar31 + 8 + lVar36 * 4) =
                       *(undefined4 *)(lVar26 + lVar25);
                  goto LAB_00137bc5;
                }
                if (*(char *)(lVar12 + 3 + lVar36) != '\0') {
                  uVar35 = (ulong)((int)local_128 + iVar43 + 2);
                  *(undefined4 *)(lVar45 + lVar36 * 4) = *(undefined4 *)(lVar15 + lVar36 * 4);
                  goto LAB_00138f8e;
                }
              }
              else {
                if (*(char *)(lVar12 + 3 + lVar36) != '\0') {
                  uVar35 = (ulong)((int)local_128 + iVar43 + 2);
                  *(undefined4 *)(lVar45 + lVar36 * 4) = *(undefined4 *)(lVar15 + lVar36 * 4);
                  goto LAB_00139819;
                }
                if (*(char *)(lVar27 + lVar36) == '\0') {
                  uVar35 = (ulong)((int)local_128 + iVar43 + 2);
                  *(undefined4 *)(lVar10 + lVar31 + 8 + lVar36 * 4) =
                       *(undefined4 *)(lVar26 + lVar25);
                  goto LAB_0013910e;
                }
              }
              if (*(char *)(lVar12 + 4 + lVar36) == '\0') {
                iVar30 = (int)local_128 + iVar43 + 2;
                *(undefined4 *)(lVar10 + lVar31 + 8 + lVar36 * 4) = *(undefined4 *)(lVar26 + lVar25)
                ;
LAB_001389d0:
                lVar11 = (long)iVar30;
                lVar27 = lVar11 << 0x20;
                lVar10 = lVar46 + lVar28 * local_f8 + lVar11;
                lVar16 = lVar46 + 3 + lVar47 + lVar11;
                lVar12 = lVar44 + lVar11 * 4;
                lVar21 = lVar31 + lVar12 + 8;
                lVar15 = 0;
                do {
                  uVar48 = lVar11 + lVar15 + 2;
                  lVar36 = lVar27 >> 0x20;
                  if (lVar13 <= (long)uVar48) {
                    uVar35 = (ulong)(iVar30 + 2) + lVar15;
                    if (iVar29 < (int)uVar35) {
                      uVar35 = uVar35 & 0xffffffff;
                      goto LAB_00138fc6;
                    }
                    uVar48 = uVar48 & 0xffffffff;
                    if (*(char *)(lVar37 + uVar48) == '\0') {
                      if (*(char *)(lVar40 + uVar48) == '\0') {
                        uVar35 = uVar35 & 0xffffffff;
                        goto LAB_00138f68;
                      }
                      if (*(char *)(lVar37 + 3 + lVar36) == '\0') goto LAB_001393ad;
                    }
                    if (*(char *)(lVar41 + 3 + lVar36) == '\0') goto LAB_001393ad;
                    if (*(char *)(lVar42 + uVar48) == '\0') goto LAB_00139441;
                    uVar35 = uVar35 & 0xffffffff;
                    goto LAB_00139389;
                  }
                  iVar23 = (int)lVar15;
                  lVar39 = lVar27 >> 0x1e;
                  if (*(char *)(lVar16 + -1 + lVar15) == '\0') {
                    if (*(char *)(lVar28 * lVar32 + lVar11 + lVar46 + 2 + lVar15) == '\0') {
                      uVar35 = (ulong)(iVar30 + iVar23 + 2);
                      goto LAB_00138349;
                    }
                    if (*(char *)(lVar16 + lVar15) == '\0') {
                      uVar35 = (ulong)(iVar30 + iVar23 + 2);
                      *(undefined4 *)(lVar12 + lVar31 + 8 + lVar15 * 4) =
                           *(undefined4 *)(lVar26 + lVar39);
                      goto LAB_00137bc5;
                    }
                    if (*(char *)(lVar10 + 3 + lVar15) != '\0') {
                      uVar35 = (ulong)(iVar30 + 2) + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar28 * lVar22 + lVar11 + lVar46) == '\0') {
                        uVar9 = UFPC::Merge(*(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 8 +
                                                     lVar15 * 4),*(uint *)(lVar26 + lVar39));
                        *(uint *)(lVar21 + lVar15 * 4) = uVar9;
                      }
                      else {
                        if (*(char *)(lVar41 + lVar36) != '\0') {
                          uVar35 = uVar35 & 0xffffffff;
                          uVar48 = lVar27 + 0x200000000 >> 0x20;
                          goto LAB_00138d2c;
                        }
                        uVar9 = UFPC::Merge(*(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 8 +
                                                     lVar15 * 4),*(uint *)(lVar26 + lVar36 * 4));
                        *(uint *)(lVar21 + lVar15 * 4) = uVar9;
                      }
                      uVar35 = uVar35 & 0xffffffff;
                      goto LAB_00138f8e;
                    }
                  }
                  else {
                    if (*(char *)(lVar10 + 3 + lVar15) != '\0') {
                      uVar35 = (ulong)(iVar30 + 2) + lVar15;
                      if (*(char *)(lVar15 + 2 + lVar28 * lVar22 + lVar11 + lVar46) == '\0') {
                        uVar9 = *(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 8 + lVar15 * 4);
                        uVar8 = *(uint *)(lVar26 + lVar39);
                      }
                      else {
                        if (*(char *)(lVar41 + lVar36) != '\0') {
                          uVar35 = uVar35 & 0xffffffff;
                          uVar48 = lVar27 + 0x200000000 >> 0x20;
                          goto LAB_00138b9e;
                        }
                        uVar9 = *(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 8 + lVar15 * 4);
                        uVar8 = *(uint *)(lVar26 + lVar36 * 4);
                      }
                      uVar9 = UFPC::Merge(uVar9,uVar8);
                      *(uint *)(lVar21 + lVar15 * 4) = uVar9;
                      uVar35 = uVar35 & 0xffffffff;
                      goto LAB_00139819;
                    }
                    if (*(char *)(lVar16 + lVar15) == '\0') goto LAB_00138bb7;
                  }
                  if (*(char *)(lVar10 + 4 + lVar15) != '\0') {
                    local_128 = (ulong)(iVar30 + 2) + lVar15;
                    if (*(char *)(lVar42 + 3 + lVar36) == '\0') {
                      uVar9 = UFPC::Merge(*(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 0x10 +
                                                   lVar15 * 4),*(uint *)(lVar26 + lVar36 * 4));
                    }
                    else {
                      if ((*(char *)(lVar15 + 2 + lVar28 * lVar22 + lVar11 + lVar46) != '\0') &&
                         (*(char *)(lVar41 + lVar36) != '\0')) {
                        uVar35 = lVar27 + 0x200000000 >> 0x20;
                        goto LAB_00138b2d;
                      }
                      uVar9 = UFPC::Merge(*(uint *)(lVar38 * lVar22 + lVar11 * 4 + lVar31 + 0x10 +
                                                   lVar15 * 4),*(uint *)(lVar26 + lVar36 * 4));
                    }
                    *(uint *)(lVar21 + lVar15 * 4) = uVar9;
                    goto LAB_001383cc;
                  }
                  *(undefined4 *)(lVar21 + lVar15 * 4) =
                       *(undefined4 *)(lVar31 + lVar12 + lVar15 * 4);
                  lVar27 = lVar27 + 0x200000000;
                  lVar15 = lVar15 + 2;
                } while( true );
              }
              uVar9 = *(uint *)(lVar11 + 0x10 + lVar36 * 4);
              if (*(char *)(lVar28 * lVar22 + lVar39 + lVar46 + 3 + lVar36) == '\0') {
                uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar31 + lVar10 + lVar36 * 4));
              }
              *(uint *)(lVar45 + lVar36 * 4) = uVar9;
              lVar21 = lVar21 + 0x200000000;
              lVar36 = lVar36 + 2;
            }
            iVar43 = (int)local_128 + 2 + iVar43;
            if (iVar29 < iVar43) goto LAB_00138fd0;
            uVar48 = uVar48 & 0xffffffff;
            if (*(char *)(lVar37 + uVar48) != '\0') {
LAB_00138629:
              if (*(char *)(lVar41 + 3 + lVar24) == '\0') goto LAB_00138717;
              goto LAB_001374ba;
            }
            cVar2 = *(char *)(lVar37 + 3 + lVar24);
            if (*(char *)(lVar40 + uVar48) == '\0') {
              if (cVar2 != '\0') goto LAB_001374ba;
              goto LAB_0013777a;
            }
            if (cVar2 != '\0') goto LAB_00138629;
LAB_00138717:
            uVar14 = *(undefined4 *)(lVar26 + lVar24 * 4);
            goto LAB_001374bd;
          }
          if (*(char *)(lVar10 + 3 + lVar41) == '\0') {
            if (*(char *)(lVar37 + 3 + lVar10) == '\0') goto LAB_001388fa;
            goto LAB_00138891;
          }
          uVar48 = uVar35;
          if (*(char *)(lVar42 + uVar35) == '\0') {
LAB_00138822:
            uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar10 * 4),*(uint *)(lVar26 + lVar10 * 4));
            *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
          }
          else {
LAB_00138b9e:
            uVar9 = *(uint *)(lVar18 + uVar48 * 4);
            if (*(char *)(lVar42 + -1 + uVar48) == '\0') {
              uVar8 = *(uint *)(lVar26 + -8 + uVar48 * 4);
              goto LAB_00139b7d;
            }
            *(uint *)(lVar26 + uVar48 * 4) = uVar9;
          }
        }
        else {
          if ((*(char *)(lVar10 + 1 + lVar11) != '\0') ||
             (*(char *)(lVar46 + lVar21 + 1 + lVar11) != '\0')) {
            uVar35 = (ulong)(iVar30 + iVar23 + 2);
            goto LAB_0013907a;
          }
          if (*(char *)(lVar46 + lVar27 + 3 + lVar11) == '\0') {
            uVar35 = (ulong)(iVar30 + 2) + lVar11;
            if (*(char *)(lVar11 + 3 + lVar47 + lVar36 + lVar46) == '\0') {
              if (*(char *)(lVar11 + 2 + lVar27 + lVar46) != '\0') {
                *(undefined4 *)(lVar15 + lVar11 * 4) = *(undefined4 *)(lVar39 + lVar11 * 4);
                goto LAB_00138090;
              }
              *(undefined4 *)(lVar12 + lVar31 + 8 + lVar11 * 4) = *(undefined4 *)(lVar18 + lVar25);
              goto LAB_00137929;
            }
            cVar2 = *(char *)(lVar11 + 2 + lVar27 + lVar46);
            if (*(char *)(lVar41 + 4 + lVar24) != '\0') {
              if (cVar2 == '\0') {
                uVar33 = lVar45 + 0x200000000 >> 0x20;
                local_128 = uVar35 & 0xffffffff;
                goto LAB_00139db9;
              }
              local_128 = uVar35 & 0xffffffff;
              goto LAB_00139ae8;
            }
            if (cVar2 == '\0') {
              *(undefined4 *)(lVar15 + lVar11 * 4) = *(undefined4 *)(lVar18 + lVar24 * 4);
              uVar35 = uVar35 & 0xffffffff;
              goto LAB_001381fa;
            }
            goto LAB_00139c91;
          }
          if (*(char *)(lVar46 + lVar27 + 2 + lVar11) != '\0') goto code_r0x001398e6;
          uVar35 = (ulong)(iVar30 + iVar23 + 2);
          uVar48 = lVar45 + 0x200000000 >> 0x20;
LAB_00139b5c:
          if (*(char *)(lVar42 + uVar48) == '\0') {
            uVar9 = *(uint *)(lVar18 + -8 + uVar48 * 4);
            uVar8 = *(uint *)(lVar18 + uVar48 * 4);
LAB_00139b7d:
            uVar9 = UFPC::Merge(uVar9,uVar8);
            *(uint *)(lVar26 + uVar48 * 4) = uVar9;
          }
          else {
            *(undefined4 *)(lVar26 + uVar48 * 4) = *(undefined4 *)(lVar18 + uVar48 * 4);
          }
        }
      } while( true );
    }
    if (uVar3 == 2) {
      uVar35 = 0;
      iVar43 = 0;
      if (cVar2 == '\0') {
LAB_0013773d:
        iVar43 = (int)uVar35;
        uVar48 = (ulong)iVar43;
        if (*(char *)(lVar40 + uVar48) == '\0') {
LAB_00137761:
          uVar48 = uVar35 & 0xffffffff;
LAB_00137764:
          iVar43 = (int)uVar48;
LAB_00137769:
          if (*(char *)(lVar37 + 1 + (long)iVar43) != '\0') goto LAB_001373f7;
LAB_0013777a:
          uVar48 = (ulong)iVar43;
          if (*(char *)(lVar40 + 1 + uVar48) == '\0') goto LAB_0013778d;
        }
        else if (*(char *)(lVar37 + 1 + uVar48) != '\0') goto LAB_001373f7;
LAB_001391e8:
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar26 + uVar48 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
      }
      else {
LAB_001373f7:
        uVar48 = (ulong)iVar43;
        if (*(char *)(lVar41 + 1 + uVar48) == '\0') goto LAB_001374ad;
LAB_001374ba:
        uVar14 = *(undefined4 *)(lVar18 + uVar48 * 4);
LAB_001374bd:
        *(undefined4 *)(lVar26 + uVar48 * 4) = uVar14;
      }
    }
    else {
      iVar43 = 0;
      uVar35 = 0;
      if (cVar2 != '\0') {
LAB_001374ad:
        uVar48 = (ulong)iVar43;
        cVar2 = *(char *)(lVar41 + uVar48);
joined_r0x00138f83:
        if (cVar2 == '\0') goto LAB_001391e8;
        goto LAB_001374ba;
      }
LAB_001376e5:
      uVar48 = (ulong)(int)uVar35;
      if (*(char *)(lVar40 + uVar48) != '\0') goto LAB_001391e8;
LAB_0013778d:
      *(undefined4 *)(lVar26 + uVar48 * 4) = 0;
    }
    goto LAB_00139212;
  }
  if ((uVar17 & 0x80000001) != 1) goto LAB_0013b085;
  uVar35 = (ulong)(uVar17 - 1);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar38 = *(long *)&pMVar4->field_0x10;
  lVar31 = **(long **)&pMVar4->field_0x48;
  lVar22 = lVar38 + lVar31 * uVar35;
  lVar42 = lVar22 - lVar31;
  lVar26 = lVar42 - lVar31;
  lVar40 = *(long *)&pMVar5->field_0x10;
  lVar46 = **(long **)&pMVar5->field_0x48;
  lVar37 = lVar40 + lVar46 * uVar35;
  lVar44 = lVar37 + lVar46 * -2;
  lVar34 = lVar42 + 1;
  lVar41 = lVar26 + -1;
  lVar47 = (uVar35 - 1) * lVar31;
  lVar32 = lVar44 + 8;
  lVar18 = lVar46 * (uVar35 - 2) + lVar40 + 0x10;
  lVar40 = lVar40 + 8 + lVar46 * uVar35;
  lVar46 = lVar47 + 4 + lVar38;
  lVar28 = lVar38 + 3 + lVar31 * uVar35;
  lVar31 = (uVar35 - 2) * lVar31 + 3 + lVar38;
  uVar35 = 0xfffffffffffffffe;
LAB_0013a1ce:
  do {
    lVar10 = (long)(int)uVar35;
    uVar35 = lVar10 + 2;
    uVar48 = uVar35;
    if (iVar29 <= (int)uVar35) {
      if (iVar29 < (int)uVar35) {
        if (*(char *)(lVar22 + uVar35) == '\0') {
LAB_0013ae8f:
          *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = 0;
          goto LAB_0013b085;
        }
LAB_0013afee:
        if (*(char *)(lVar42 + uVar48) == '\0') {
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar9 = UFPC::length_ + 1;
          *(uint *)(lVar37 + uVar48 * 4) = UFPC::length_;
          UFPC::length_ = uVar9;
          goto LAB_0013b085;
        }
      }
      else {
        if (*(char *)(lVar22 + uVar35) == '\0') {
LAB_0013afde:
          uVar48 = uVar35;
          if (*(char *)(lVar22 + 1 + uVar35) == '\0') {
LAB_0013b003:
            *(undefined4 *)(lVar37 + uVar48 * 4) = 0;
            goto LAB_0013b085;
          }
        }
        if (*(char *)(lVar42 + 1 + uVar48) == '\0') goto LAB_0013afee;
      }
LAB_0013aff5:
      uVar9 = *(uint *)(lVar44 + uVar48 * 4);
LAB_0013affa:
      *(uint *)(lVar37 + uVar48 * 4) = uVar9;
      goto LAB_0013b085;
    }
    if (*(char *)(lVar22 + uVar35) == '\0') goto LAB_0013a22b;
    if (*(char *)(lVar10 + 3 + lVar42) != '\0') goto LAB_0013a385;
    if (*(char *)(lVar22 + 3 + lVar10) != '\0') {
LAB_0013a246:
      uVar48 = (ulong)(int)uVar35;
      if (*(char *)(lVar42 + 2 + uVar48) == '\0') {
        if (*(char *)(lVar42 + uVar48) == '\0') goto LAB_0013a552;
        goto LAB_0013a292;
      }
      if (*(char *)(lVar42 + uVar48) == '\0') goto LAB_0013a53e;
LAB_0013a26a:
      lVar10 = (long)(int)uVar35;
      if (*(char *)(lVar26 + 1 + lVar10) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar44 + lVar10 * 4),*(uint *)(lVar44 + 8 + lVar10 * 4));
      }
      else {
        uVar9 = *(uint *)(lVar32 + lVar10 * 4);
      }
      *(uint *)(lVar37 + lVar10 * 4) = uVar9;
LAB_0013a572:
      iVar30 = (int)uVar35;
      lVar11 = (long)iVar30;
      lVar15 = lVar11 << 0x20;
      lVar10 = lVar46 + lVar11;
      lVar12 = lVar18 + lVar11 * 4;
      lVar16 = lVar40 + lVar11 * 4;
      lVar21 = 0;
      do {
        uVar48 = lVar11 + lVar21 + 2;
        lVar27 = lVar15 >> 0x20;
        if (lVar13 <= (long)uVar48) {
          uVar48 = (ulong)(iVar30 + 2) + lVar21;
          if (iVar29 < (int)uVar48) goto LAB_0013ac79;
          lVar34 = lVar15 + 0x200000000 >> 0x20;
          if (*(char *)(lVar22 + lVar34) == '\0') {
            if (*(char *)(lVar22 + 3 + lVar27) == '\0') {
              *(undefined4 *)(lVar37 + lVar34 * 4) = 0;
              goto LAB_0013b085;
            }
LAB_0013ae5e:
            uVar14 = *(undefined4 *)(lVar44 + lVar34 * 4);
          }
          else {
            if (*(char *)(lVar42 + 3 + lVar27) != '\0') goto LAB_0013ae5e;
            uVar14 = *(undefined4 *)(lVar37 + lVar27 * 4);
          }
          *(undefined4 *)(lVar37 + lVar34 * 4) = uVar14;
          goto LAB_0013b085;
        }
        if (*(char *)(lVar28 + lVar11 + -1 + lVar21) == '\0') {
          uVar35 = (ulong)(iVar30 + 2) + lVar21;
          iVar30 = (int)uVar35;
          lVar10 = lVar15 + 0x300000000 >> 0x20;
          if (*(char *)(lVar22 + lVar10) == '\0') goto LAB_0013a356;
          if (*(char *)(lVar42 + lVar10) != '\0') goto LAB_0013a508;
          if (*(char *)(lVar42 + 4 + lVar27) == '\0') goto LAB_0013a292;
          goto LAB_0013a26a;
        }
        iVar23 = (int)lVar21;
        if (*(char *)(lVar10 + -1 + lVar21) != '\0') {
          uVar35 = (ulong)(iVar30 + iVar23 + 2);
          *(undefined4 *)(lVar16 + lVar21 * 4) = *(undefined4 *)(lVar12 + -8 + lVar21 * 4);
          goto LAB_0013a961;
        }
        if (*(char *)(lVar28 + lVar11 + lVar21) == '\0') {
          uVar35 = (ulong)(iVar30 + iVar23 + 2);
          *(undefined4 *)(lVar16 + lVar21 * 4) = *(undefined4 *)(lVar37 + (lVar15 >> 0x1e));
          goto LAB_0013a1ce;
        }
        if (*(char *)(lVar10 + lVar21) == '\0') goto LAB_0013a6f1;
        uVar9 = *(uint *)(lVar12 + lVar21 * 4);
        if (*(char *)(lVar31 + lVar11 + lVar21) == '\0') {
          uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar16 + -8 + lVar21 * 4));
        }
        *(uint *)(lVar16 + lVar21 * 4) = uVar9;
        lVar15 = lVar15 + 0x200000000;
        lVar21 = lVar21 + 2;
      } while( true );
    }
    if (*(char *)(lVar42 + uVar35) == '\0') {
LAB_0013a209:
      UFPC::P_[UFPC::length_] = UFPC::length_;
      uVar9 = UFPC::length_ + 1;
      *(uint *)(lVar37 + 8 + lVar10 * 4) = UFPC::length_;
      UFPC::length_ = uVar9;
      uVar35 = uVar48;
    }
    else {
LAB_0013a3f0:
      *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = *(undefined4 *)(lVar44 + 8 + lVar10 * 4);
      uVar35 = uVar48;
    }
  } while( true );
LAB_00136ea6:
  uVar14 = *(undefined4 *)(lVar13 + uVar48 * 4);
  uVar35 = uVar33 & 0xffffffff;
LAB_00136ead:
  *(undefined4 *)(lVar13 + uVar33 * 4) = uVar14;
  goto LAB_00136e22;
LAB_001372a8:
  *(undefined4 *)(lVar37 + uVar35 * 4) = *(undefined4 *)(lVar37 + -8 + uVar35 * 4);
  goto LAB_00137324;
LAB_0013a0b3:
  if (*(char *)(lVar41 + uVar33) == '\0') {
LAB_00139e47:
    uVar14 = *(undefined4 *)(lVar26 + lVar25);
  }
  else {
    uVar14 = *(undefined4 *)(lVar18 + uVar33 * 4);
  }
LAB_0013a073:
  *(undefined4 *)(lVar26 + uVar33 * 4) = uVar14;
  goto LAB_00139212;
LAB_00138bb7:
  uVar35 = (ulong)(iVar30 + iVar23 + 2);
  *(undefined4 *)(lVar12 + lVar31 + 8 + lVar15 * 4) = *(undefined4 *)(lVar26 + lVar39);
LAB_0013910e:
  lVar36 = (long)(int)uVar35;
  uVar35 = lVar36 + 2;
  if ((int)uVar35 < iVar29) {
    if (*(char *)(lVar37 + uVar35) != '\0') {
      local_128 = uVar35;
      if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_00137461;
      if (*(char *)(lVar36 + 3 + lVar41) == '\0') {
        if (*(char *)(lVar37 + 3 + lVar36) == '\0') {
          if (*(char *)(lVar41 + uVar35) == '\0') goto LAB_001395d3;
          if (*(char *)(lVar41 + lVar36) != '\0') goto LAB_001395c1;
          uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar36 * 4),*(uint *)(lVar26 + lVar36 * 4));
          *(uint *)(lVar26 + 8 + lVar36 * 4) = uVar9;
          goto LAB_00138090;
        }
        goto LAB_0013947f;
      }
      if (*(char *)(lVar41 + lVar36) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar36 * 4),*(uint *)(lVar26 + lVar36 * 4));
        *(uint *)(lVar26 + 8 + lVar36 * 4) = uVar9;
      }
      else {
LAB_00139157:
        if (*(char *)(lVar42 + -1 + uVar35) != '\0') goto LAB_00139088;
        uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar35 * 4),*(uint *)(lVar26 + -8 + uVar35 * 4));
        *(uint *)(lVar26 + uVar35 * 4) = uVar9;
      }
      goto LAB_00139819;
    }
    if (*(char *)(lVar40 + uVar35) == '\0') {
LAB_0013934e:
      uVar35 = uVar35 & 0xffffffff;
      goto LAB_0013755d;
    }
    if (*(char *)(lVar36 + 3 + lVar37) == '\0') goto LAB_00137b81;
    uVar33 = uVar35;
    if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_00137573;
    if (*(char *)(lVar41 + 3 + lVar36) != '\0') {
      if (*(char *)(lVar41 + lVar36) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar36 * 4),*(uint *)(lVar26 + lVar36 * 4));
        *(uint *)(lVar26 + 8 + lVar36 * 4) = uVar9;
        goto LAB_00138f8e;
      }
LAB_00139308:
      uVar48 = uVar35;
      if (*(char *)(lVar42 + -1 + uVar35) != '\0') goto LAB_00139a4a;
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar35 * 4),*(uint *)(lVar26 + -8 + uVar35 * 4));
      *(uint *)(lVar26 + uVar35 * 4) = uVar9;
      goto LAB_00138f8e;
    }
LAB_0013947f:
    if (*(char *)(lVar36 + 4 + lVar41) == '\0') {
      if (*(char *)(lVar41 + 2 + lVar36) == '\0') {
LAB_00139615:
        *(undefined4 *)(lVar26 + 8 + lVar36 * 4) = *(undefined4 *)(lVar26 + lVar36 * 4);
        uVar35 = uVar35 & 0xffffffff;
LAB_001381fa:
        do {
          lVar10 = (long)(int)uVar35;
          uVar35 = lVar10 + 2;
          iVar30 = (int)uVar35;
          if (iVar29 <= iVar30) {
            if (iVar29 < iVar30) goto LAB_00138fc6;
            uVar48 = uVar35 & 0xffffffff;
            if (*(char *)(lVar37 + uVar48) == '\0') {
              if (*(char *)(lVar40 + uVar48) == '\0') goto LAB_00138f68;
              if (*(char *)(lVar37 + 3 + lVar10) == '\0') goto LAB_001388e3;
            }
            if (*(char *)(lVar41 + 3 + lVar10) != '\0') goto LAB_001387f5;
            goto LAB_001388e3;
          }
          if (*(char *)(lVar37 + uVar35) != '\0') {
            if (*(char *)(lVar10 + 3 + lVar41) != '\0') goto LAB_00138822;
            if (*(char *)(lVar37 + 3 + lVar10) == '\0') goto LAB_001388fa;
LAB_001382c9:
            if (*(char *)(lVar10 + 4 + lVar41) != '\0') {
              uVar9 = UFPC::Merge(*(uint *)(lVar18 + 0x10 + lVar10 * 4),
                                  *(uint *)(lVar26 + lVar10 * 4));
              *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
              local_128 = uVar35 & 0xffffffff;
              goto LAB_001383cc;
            }
            *(undefined4 *)(lVar26 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
            goto LAB_001389d0;
          }
          if (*(char *)(lVar40 + uVar35) != '\0') {
            if (*(char *)(lVar10 + 3 + lVar37) != '\0') {
              if (*(char *)(lVar41 + 3 + lVar10) != '\0') {
                uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar10 * 4),
                                    *(uint *)(lVar26 + lVar10 * 4));
                *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
                goto LAB_00138f8e;
              }
              goto LAB_001382c9;
            }
            goto LAB_001388eb;
          }
LAB_00138349:
          lVar10 = (long)(int)uVar35;
          if (*(char *)(lVar10 + 1 + lVar37) == '\0') {
            uVar35 = uVar35 & 0xffffffff;
LAB_00137606:
            uVar9 = UFPC::length_;
            lVar10 = (long)(int)uVar35;
            if (*(char *)(lVar40 + 1 + lVar10) != '\0') {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar8 = UFPC::length_ + 1;
              *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
              UFPC::length_ = uVar8;
              uVar48 = lVar10 + 2;
              iVar30 = (int)uVar48;
              if (iVar30 < iVar29) {
                if (*(char *)(lVar37 + uVar48) != '\0') {
                  uVar35 = uVar48 & 0xffffffff;
                  goto LAB_00137c00;
                }
                if (*(char *)(lVar40 + uVar48) == '\0') {
                  uVar35 = uVar48 & 0xffffffff;
                  goto LAB_0013755d;
                }
                if (*(char *)(lVar37 + 3 + lVar10) != '\0') {
                  uVar35 = uVar48 & 0xffffffff;
                  goto LAB_00137a1c;
                }
                *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
                uVar35 = uVar48;
                goto LAB_0013a001;
              }
              uVar35 = uVar48 & 0xffffffff;
              if (iVar29 < iVar30) {
                if (*(char *)(lVar37 + uVar35) == '\0') {
                  lVar46 = (long)iVar30;
                  goto LAB_00138fd9;
                }
                uVar35 = uVar48 & 0xffffffff;
LAB_00137cc3:
                uVar48 = (ulong)(int)uVar35;
                if (*(char *)(lVar41 + -1 + uVar48) != '\0') {
                  uVar9 = *(uint *)(lVar18 + -8 + uVar48 * 4);
                  goto LAB_00137dfb;
                }
              }
              else {
                if (*(char *)(lVar37 + uVar35) != '\0') {
                  uVar35 = uVar48 & 0xffffffff;
LAB_00137c84:
                  uVar48 = (ulong)(int)uVar35;
                  if (*(char *)(lVar41 + 1 + uVar48) == '\0') goto LAB_00137cc3;
                  if ((*(char *)(lVar41 + uVar48) != '\0') ||
                     (*(char *)(lVar41 + -1 + uVar48) == '\0')) goto LAB_00137df8;
                  if (*(char *)(lVar42 + uVar48) == '\0') {
                    uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + uVar48 * 4),
                                        *(uint *)(lVar18 + uVar48 * 4));
                    uVar8 = *(uint *)(lVar26 + -8 + uVar48 * 4);
                  }
                  else {
                    uVar9 = *(uint *)(lVar18 + uVar48 * 4);
                    uVar8 = *(uint *)(lVar26 + -8 + uVar48 * 4);
                  }
                  uVar9 = UFPC::Merge(uVar9,uVar8);
                  *(uint *)(lVar26 + uVar48 * 4) = uVar9;
                  goto LAB_00139212;
                }
                if (*(char *)(lVar40 + uVar35) == '\0') goto LAB_00137764;
                if (*(char *)(lVar37 + 3 + lVar10) == '\0') {
                  *(uint *)(lVar26 + uVar35 * 4) = uVar9;
                  goto LAB_00139212;
                }
                uVar48 = (ulong)iVar30;
LAB_00137de1:
                if (*(char *)(lVar41 + 1 + uVar48) != '\0') goto LAB_00137df8;
              }
LAB_00137ded:
              if (*(char *)(lVar41 + uVar48) != '\0') goto LAB_00137df8;
              uVar14 = *(undefined4 *)(lVar26 + -8 + uVar48 * 4);
              goto LAB_001393b1;
            }
            *(undefined4 *)(lVar26 + lVar10 * 4) = 0;
            uVar35 = lVar10 + 2;
            if (iVar29 <= (int)uVar35) {
              cVar2 = *(char *)(lVar37 + (uVar35 & 0xffffffff));
              if (iVar29 < (int)uVar35) {
                if (cVar2 == '\0') goto LAB_001376e5;
              }
              else {
                if (cVar2 == '\0') goto LAB_0013773d;
LAB_00137d37:
                uVar48 = (ulong)(int)uVar35;
                if (*(char *)(lVar41 + 1 + uVar48) != '\0') {
                  if ((*(char *)(lVar41 + uVar48) != '\0') ||
                     (*(char *)(lVar41 + -1 + uVar48) == '\0')) goto LAB_0013929c;
                  goto LAB_00137d5e;
                }
              }
LAB_00137d7b:
              uVar48 = (ulong)(int)uVar35;
              if (*(char *)(lVar41 + uVar48) != '\0') goto LAB_001374ba;
              if (*(char *)(lVar41 + -1 + uVar48) == '\0') goto LAB_001391e8;
              uVar14 = *(undefined4 *)(lVar18 + -8 + uVar48 * 4);
              goto LAB_001374bd;
            }
            if (*(char *)(lVar37 + uVar35) == '\0') goto LAB_0013752a;
LAB_001377e9:
            iVar30 = (int)uVar35;
            uVar48 = (ulong)iVar30;
            if (*(char *)(uVar48 + 1 + lVar41) != '\0') {
              if (*(char *)(lVar41 + uVar48) != '\0') {
                *(undefined4 *)(lVar26 + uVar48 * 4) = *(undefined4 *)(lVar18 + uVar48 * 4);
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00139819;
              }
              if (*(char *)(lVar41 + -1 + uVar48) != '\0') {
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00139b5c;
              }
              *(undefined4 *)(lVar26 + uVar48 * 4) = *(undefined4 *)(lVar18 + uVar48 * 4);
              uVar35 = uVar35 & 0xffffffff;
              goto LAB_00139819;
            }
            if (*(char *)(lVar37 + 1 + uVar48) != '\0') {
              uVar33 = (ulong)iVar30;
              if (*(char *)(lVar41 + 2 + uVar33) != '\0') {
                local_128 = uVar35;
                if (*(char *)(lVar41 + uVar33) != '\0') goto LAB_00139ae8;
                if (*(char *)(lVar41 + -1 + uVar33) != '\0') goto LAB_00139db9;
                goto LAB_001390e1;
              }
              if (*(char *)(lVar41 + uVar33) != '\0') {
                *(undefined4 *)(lVar26 + uVar33 * 4) = *(undefined4 *)(lVar18 + uVar33 * 4);
                goto LAB_00138775;
              }
              if (*(char *)(lVar41 + -1 + uVar33) == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar9 = UFPC::length_ + 1;
                *(uint *)(lVar26 + uVar33 * 4) = UFPC::length_;
                UFPC::length_ = uVar9;
              }
              else {
                *(undefined4 *)(lVar26 + uVar33 * 4) = *(undefined4 *)(lVar18 + -8 + uVar33 * 4);
              }
              goto LAB_001381fa;
            }
            lVar10 = (long)iVar30;
            if (*(char *)(lVar41 + lVar10) == '\0') {
              if (*(char *)(lVar41 + -1 + lVar10) == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar9 = UFPC::length_ + 1;
                *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
                UFPC::length_ = uVar9;
              }
              else {
                *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + -8 + lVar10 * 4);
              }
              uVar35 = uVar35 & 0xffffffff;
              goto LAB_00137929;
            }
            *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
            uVar35 = uVar35 & 0xffffffff;
LAB_00138090:
            lVar36 = (long)(int)uVar35;
            uVar35 = lVar36 + 2;
            if (iVar29 <= (int)uVar35) {
              uVar48 = uVar35 & 0xffffffff;
              if (iVar29 < (int)uVar35) {
                if (*(char *)(lVar37 + uVar48) == '\0') goto LAB_001391bf;
                if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_001391b2;
              }
              else {
                if (*(char *)(lVar37 + uVar48) == '\0') {
                  if (*(char *)(lVar40 + uVar48) == '\0') goto LAB_0013941f;
                  if (*(char *)(lVar37 + 3 + lVar36) == '\0') goto LAB_00139412;
                }
                if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_001392b2;
                if (*(char *)(lVar41 + 3 + lVar36) != '\0') goto LAB_0013927d;
              }
              if (*(char *)(lVar41 + uVar48) != '\0') goto LAB_00139397;
              goto LAB_001393ad;
            }
            if (*(char *)(lVar37 + uVar35) == '\0') {
              if (*(char *)(lVar40 + uVar35) == '\0') goto LAB_0013934e;
              if (*(char *)(lVar36 + 3 + lVar37) == '\0') goto LAB_00137b81;
              uVar33 = uVar35;
              if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_00137573;
              if (*(char *)(lVar41 + 3 + lVar36) != '\0') goto LAB_00139308;
LAB_00138197:
              if (*(char *)(lVar36 + 4 + lVar41) == '\0') {
                uVar48 = uVar35;
                if (*(char *)(lVar41 + uVar35) == '\0') goto LAB_00139615;
                goto LAB_001395f4;
              }
              if (*(char *)(lVar42 + 3 + lVar36) != '\0') goto LAB_001394a7;
              if (*(char *)(lVar41 + uVar35) != '\0') goto LAB_00139673;
              goto LAB_0013969b;
            }
            local_128 = uVar35;
            if (*(char *)(lVar40 + 1 + lVar36) == '\0') goto LAB_00137461;
            if (*(char *)(lVar36 + 3 + lVar41) != '\0') goto LAB_00139157;
            if (*(char *)(lVar37 + 3 + lVar36) != '\0') goto LAB_00138197;
            if (*(char *)(lVar41 + uVar35) != '\0') {
LAB_001395c1:
              uVar9 = *(uint *)(lVar18 + uVar35 * 4);
              if (*(char *)(lVar42 + -1 + uVar35) == '\0') {
                uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar35 * 4));
                *(uint *)(lVar26 + uVar35 * 4) = uVar9;
              }
              else {
                *(uint *)(lVar26 + uVar35 * 4) = uVar9;
              }
              goto LAB_00138090;
            }
LAB_001395d3:
            *(undefined4 *)(lVar26 + 8 + lVar36 * 4) = *(undefined4 *)(lVar26 + lVar36 * 4);
LAB_00137929:
            lVar10 = (long)(int)uVar35;
            local_128 = lVar10 + 2;
            iVar30 = (int)local_128;
            if (iVar29 <= iVar30) {
              uVar48 = local_128 & 0xffffffff;
              if (iVar29 < iVar30) {
                if (*(char *)(lVar37 + uVar48) == '\0') {
                  uVar35 = local_128 & 0xffffffff;
                  goto LAB_001391bf;
                }
                if (*(char *)(lVar40 + 1 + lVar10) == '\0') goto LAB_001391b5;
                uVar48 = (ulong)iVar30;
                goto LAB_00137ded;
              }
              if (*(char *)(lVar37 + uVar48) == '\0') {
LAB_00137db1:
                iVar43 = (int)local_128;
                if (*(char *)(lVar40 + uVar48) == '\0') goto LAB_00137769;
                uVar48 = (ulong)iVar43;
                if (*(char *)(lVar37 + 1 + uVar48) == '\0') goto LAB_001391d5;
              }
              else {
                uVar48 = (ulong)iVar30;
              }
              iVar43 = (int)local_128;
              if (*(char *)(lVar40 + -1 + uVar48) == '\0') goto LAB_001373f7;
              goto LAB_00137de1;
            }
            if (*(char *)(lVar37 + local_128) != '\0') {
              if (*(char *)(lVar40 + 1 + lVar10) == '\0') goto LAB_00137461;
              if (*(char *)(lVar10 + 3 + lVar41) != '\0') {
                uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar10 * 4),
                                    *(uint *)(lVar26 + lVar10 * 4));
                *(uint *)(lVar26 + 8 + lVar10 * 4) = uVar9;
                goto LAB_00137c42;
              }
              uVar35 = local_128 & 0xffffffff;
              if (*(char *)(lVar37 + 3 + lVar10) == '\0') goto LAB_00137f8a;
LAB_00137a66:
              lVar10 = (long)(int)local_128;
              if (*(char *)(lVar10 + 2 + lVar41) == '\0') {
                uVar35 = local_128 & 0xffffffff;
                goto LAB_00137acc;
              }
              if (*(char *)(lVar42 + 1 + lVar10) == '\0') {
                if (*(char *)(lVar41 + lVar10) == '\0') {
                  uVar8 = *(uint *)(lVar18 + 8 + lVar10 * 4);
                  uVar9 = *(uint *)(lVar26 + -8 + lVar10 * 4);
                }
                else {
                  uVar8 = UFPC::Merge(*(uint *)(lVar18 + lVar10 * 4),
                                      *(uint *)(lVar18 + 8 + lVar10 * 4));
                  uVar9 = *(uint *)(lVar26 + -8 + lVar10 * 4);
                }
                uVar9 = UFPC::Merge(uVar8,uVar9);
                *(uint *)(lVar26 + lVar10 * 4) = uVar9;
              }
              else {
                uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar10 * 4),
                                    *(uint *)(lVar26 + -8 + lVar10 * 4));
                *(uint *)(lVar26 + lVar10 * 4) = uVar9;
              }
              goto LAB_001383cc;
            }
LAB_001379e7:
            uVar35 = local_128 & 0xffffffff;
            uVar48 = (ulong)(int)local_128;
            if (*(char *)(lVar40 + uVar48) == '\0') goto LAB_0013934e;
            if (*(char *)(lVar37 + 1 + uVar48) == '\0') {
LAB_00137b81:
              iVar30 = (int)uVar35;
              uVar35 = uVar35 & 0xffffffff;
              lVar10 = (long)iVar30;
              if (*(char *)(lVar40 + -1 + lVar10) == '\0') {
LAB_00137b9d:
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar9 = UFPC::length_ + 1;
                *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
                UFPC::length_ = uVar9;
              }
              else {
                *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar26 + -8 + lVar10 * 4);
              }
LAB_00137bc5:
              lVar10 = (long)(int)uVar35;
              uVar35 = lVar10 + 2;
              iVar43 = (int)uVar35;
              if (iVar29 <= iVar43) {
                uVar48 = uVar35 & 0xffffffff;
                if (iVar43 <= iVar29) {
                  if (*(char *)(lVar37 + uVar48) != '\0') {
                    if (*(char *)(lVar40 + 1 + lVar10) == '\0') goto LAB_00137d37;
                    goto LAB_00137c84;
                  }
                  local_128 = uVar35 & 0xffffffff;
                  goto LAB_00137db1;
                }
                if (*(char *)(lVar37 + uVar48) == '\0') goto LAB_001391c4;
                if (*(char *)(lVar40 + 1 + lVar10) == '\0') goto LAB_00137d7b;
                goto LAB_00137cc3;
              }
              local_128 = uVar35;
              if (*(char *)(lVar37 + uVar35) != '\0') goto code_r0x00137be0;
              goto LAB_001379e7;
            }
            uVar33 = uVar35;
            if (*(char *)(lVar40 + -1 + uVar48) == '\0') goto LAB_00137573;
LAB_00137a1c:
            local_128 = uVar35;
            if (*(char *)(lVar41 + 1 + uVar48) == '\0') goto LAB_00137a66;
            uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar48 * 4),*(uint *)(lVar26 + -8 + uVar48 * 4));
            *(uint *)(lVar26 + uVar48 * 4) = uVar9;
LAB_00138f8e:
            lVar10 = (long)(int)uVar35;
            uVar35 = lVar10 + 2;
            if (iVar29 <= (int)uVar35) {
              if (iVar29 < (int)uVar35) {
                uVar35 = uVar35 & 0xffffffff;
                goto LAB_00138fc6;
              }
              uVar33 = uVar35 & 0xffffffff;
              if (*(char *)(lVar37 + uVar33) != '\0') goto LAB_00138fff;
              if (*(char *)(lVar40 + uVar33) == '\0') goto LAB_00137761;
              if (*(char *)(lVar37 + 3 + lVar10) != '\0') goto LAB_00138fff;
              uVar14 = *(undefined4 *)(lVar26 + lVar10 * 4);
              goto LAB_0013a073;
            }
            if (*(char *)(lVar37 + uVar35) != '\0') goto LAB_0013907a;
            if (*(char *)(lVar40 + uVar35) != '\0') {
              if (*(char *)(lVar37 + 3 + lVar10) != '\0') {
                uVar48 = uVar35 & 0xffffffff;
                uVar33 = uVar35;
LAB_00139a37:
                uVar35 = uVar48 & 0xffffffff;
                if (*(char *)(lVar41 + 1 + uVar33) != '\0') goto LAB_00139a4a;
                goto LAB_001390b1;
              }
              *(undefined4 *)(lVar26 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
              goto LAB_00137bc5;
            }
LAB_0013755d:
            uVar33 = uVar35 & 0xffffffff;
            if (*(char *)(lVar37 + 1 + (long)(int)uVar35) == '\0') goto LAB_00137606;
LAB_00137573:
            uVar35 = uVar33;
            lVar10 = (long)(int)uVar35;
            if (*(char *)(lVar41 + 1 + lVar10) != '\0') {
              *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
              goto LAB_00138f8e;
            }
            uVar35 = uVar35 & 0xffffffff;
LAB_0013759a:
            lVar10 = (long)(int)uVar35;
            if (*(char *)(lVar41 + 2 + lVar10) != '\0') {
              local_128 = uVar35;
              if (*(char *)(lVar41 + lVar10) != '\0') goto LAB_00139ae8;
              *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + 8 + lVar10 * 4);
              goto LAB_001383cc;
            }
            if (*(char *)(lVar41 + lVar10) != '\0') {
              *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
              goto LAB_00138775;
            }
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
          }
          else {
            if (*(char *)(lVar41 + 1 + lVar10) != '\0') {
              *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
              goto LAB_00138f8e;
            }
            if (*(char *)(lVar10 + 2 + lVar41) != '\0') {
              *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + 8 + lVar10 * 4);
              goto LAB_0013838d;
            }
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar9 = UFPC::length_ + 1;
            *(uint *)(lVar26 + lVar10 * 4) = UFPC::length_;
            UFPC::length_ = uVar9;
            uVar35 = uVar35 & 0xffffffff;
          }
        } while( true );
      }
      uVar48 = uVar35;
      if (*(char *)(lVar41 + lVar36) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar36 * 4),*(uint *)(lVar26 + lVar36 * 4));
        *(uint *)(lVar26 + 8 + lVar36 * 4) = uVar9;
        uVar35 = uVar35 & 0xffffffff;
      }
      else {
LAB_001395f4:
        uVar35 = uVar48 & 0xffffffff;
        uVar9 = *(uint *)(lVar18 + uVar48 * 4);
        if (*(char *)(lVar42 + -1 + uVar48) == '\0') {
          uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar48 * 4));
          *(uint *)(lVar26 + uVar48 * 4) = uVar9;
        }
        else {
          *(uint *)(lVar26 + uVar48 * 4) = uVar9;
        }
      }
      goto LAB_00138775;
    }
    if (*(char *)(lVar42 + 3 + lVar36) == '\0') {
      if (*(char *)(lVar41 + uVar35) == '\0') goto LAB_0013969b;
      if (*(char *)(lVar41 + lVar36) != '\0') {
LAB_00139673:
        if (*(char *)(lVar42 + -1 + uVar35) == '\0') {
          uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar35 * 4),*(uint *)(lVar18 + 8 + uVar35 * 4));
          uVar8 = *(uint *)(lVar26 + -8 + uVar35 * 4);
        }
        else {
          uVar9 = *(uint *)(lVar18 + 8 + uVar35 * 4);
          uVar8 = *(uint *)(lVar26 + -8 + uVar35 * 4);
        }
        uVar9 = UFPC::Merge(uVar9,uVar8);
        *(uint *)(lVar26 + uVar35 * 4) = uVar9;
        local_128 = uVar35 & 0xffffffff;
        goto LAB_001383cc;
      }
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + lVar36 * 4),*(uint *)(lVar18 + 0x10 + lVar36 * 4));
      uVar8 = *(uint *)(lVar26 + lVar36 * 4);
    }
    else {
      if (*(char *)(lVar41 + lVar36) != '\0') {
LAB_001394a7:
        local_128 = uVar35 & 0xffffffff;
        cVar2 = *(char *)(lVar42 + -1 + uVar35);
        uVar33 = uVar35;
        goto joined_r0x001390d0;
      }
LAB_0013969b:
      uVar9 = *(uint *)(lVar18 + 0x10 + lVar36 * 4);
      uVar8 = *(uint *)(lVar26 + lVar36 * 4);
    }
    uVar9 = UFPC::Merge(uVar9,uVar8);
    *(uint *)(lVar26 + 8 + lVar36 * 4) = uVar9;
LAB_0013838d:
    local_128 = uVar35 & 0xffffffff;
    goto LAB_001383cc;
  }
  uVar48 = uVar35 & 0xffffffff;
  if (iVar29 < (int)uVar35) {
    if (*(char *)(lVar37 + uVar48) == '\0') {
LAB_001391bf:
      iVar43 = (int)uVar35;
LAB_001391c4:
      if (*(char *)(lVar40 + uVar48) == '\0') {
        *(undefined4 *)(lVar26 + uVar48 * 4) = 0;
        goto LAB_00139212;
      }
LAB_001391d5:
      uVar48 = (ulong)iVar43;
      if (*(char *)(lVar40 + -1 + uVar48) == '\0') goto LAB_001391e8;
      uVar14 = *(undefined4 *)(lVar26 + -8 + uVar48 * 4);
      goto LAB_001374bd;
    }
    if (*(char *)(lVar40 + 1 + lVar36) == '\0') {
LAB_001391b2:
      local_128 = uVar35 & 0xffffffff;
LAB_001391b5:
      iVar43 = (int)local_128;
      goto LAB_001374ad;
    }
  }
  else {
    if (*(char *)(lVar37 + uVar48) == '\0') {
      if (*(char *)(lVar40 + uVar48) == '\0') {
LAB_0013941f:
        uVar48 = uVar35 & 0xffffffff;
        goto LAB_00137764;
      }
      if (*(char *)(lVar37 + 3 + lVar36) == '\0') {
LAB_00139412:
        iVar43 = (int)uVar35;
        goto LAB_001391d5;
      }
    }
    if (*(char *)(lVar40 + 1 + lVar36) == '\0') {
LAB_001392b2:
      iVar43 = (int)uVar35;
      goto LAB_001373f7;
    }
    if (*(char *)(lVar41 + 3 + lVar36) != '\0') {
      if (*(char *)(lVar41 + lVar36) == '\0') goto LAB_00139441;
LAB_0013927d:
      uVar48 = (ulong)(int)uVar35;
      if (*(char *)(lVar42 + -1 + uVar48) != '\0') goto LAB_00139291;
      uVar9 = *(uint *)(lVar18 + uVar48 * 4);
      uVar8 = *(uint *)(lVar26 + -8 + uVar48 * 4);
      goto LAB_0013950d;
    }
  }
  if (*(char *)(lVar41 + uVar48) != '\0') goto LAB_00139389;
LAB_001393ad:
  uVar14 = *(undefined4 *)(lVar26 + lVar36 * 4);
LAB_001393b1:
  *(undefined4 *)(lVar26 + uVar48 * 4) = uVar14;
  goto LAB_00139212;
LAB_001388fa:
  *(undefined4 *)(lVar26 + 8 + lVar10 * 4) = *(undefined4 *)(lVar26 + lVar10 * 4);
  uVar35 = uVar35 & 0xffffffff;
  goto LAB_0013910e;
LAB_00138fff:
  uVar48 = (ulong)(int)uVar35;
  if (*(char *)(lVar41 + 1 + uVar48) == '\0') {
    uVar14 = *(undefined4 *)(lVar26 + -8 + uVar48 * 4);
  }
  else {
LAB_00139291:
    if (*(char *)(lVar41 + uVar48) == '\0') {
      uVar9 = *(uint *)(lVar18 + uVar48 * 4);
      if (*(char *)(lVar42 + uVar48) == '\0') {
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar48 * 4));
        *(uint *)(lVar26 + uVar48 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar26 + uVar48 * 4) = uVar9;
      }
      goto LAB_00139212;
    }
LAB_0013929c:
    uVar14 = *(undefined4 *)(lVar18 + uVar48 * 4);
  }
LAB_001392a0:
  *(undefined4 *)(lVar26 + uVar48 * 4) = uVar14;
LAB_00139212:
  lVar34 = lVar34 + 2;
  lVar22 = lVar22 + 2;
  local_f8 = local_f8 + 2;
  lVar32 = lVar32 + 2;
  goto LAB_0013732e;
LAB_0013907a:
  uVar33 = (ulong)(int)uVar35;
  if (*(char *)(uVar33 + 1 + lVar41) != '\0') {
    uVar35 = uVar35 & 0xffffffff;
LAB_00139088:
    lVar10 = (long)(int)uVar35;
    if (*(char *)(lVar41 + lVar10) == '\0') {
      uVar9 = *(uint *)(lVar18 + lVar10 * 4);
      if (*(char *)(lVar42 + lVar10) == '\0') {
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + lVar10 * 4));
        *(uint *)(lVar26 + lVar10 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar26 + lVar10 * 4) = uVar9;
      }
    }
    else {
      *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
    }
    goto LAB_00139819;
  }
  if (*(char *)(lVar37 + 1 + uVar33) != '\0') {
LAB_001390b1:
    iVar30 = (int)uVar35;
    local_128 = uVar35;
    if (*(char *)(lVar41 + 2 + uVar33) != '\0') goto LAB_001390ca;
    *(undefined4 *)(lVar26 + uVar33 * 4) = *(undefined4 *)(lVar26 + -8 + uVar33 * 4);
    goto LAB_001389d0;
  }
  *(undefined4 *)(lVar26 + uVar33 * 4) = *(undefined4 *)(lVar26 + -8 + uVar33 * 4);
  goto LAB_0013910e;
LAB_00139a4a:
  uVar35 = uVar48;
  lVar10 = (long)(int)uVar35;
  if (*(char *)(lVar41 + lVar10) == '\0') {
    uVar9 = *(uint *)(lVar18 + lVar10 * 4);
    if (*(char *)(lVar42 + lVar10) == '\0') {
      uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + lVar10 * 4));
      *(uint *)(lVar26 + lVar10 * 4) = uVar9;
    }
    else {
      *(uint *)(lVar26 + lVar10 * 4) = uVar9;
    }
  }
  else {
    *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar18 + lVar10 * 4);
  }
  goto LAB_00138f8e;
LAB_001390ca:
  cVar2 = *(char *)(lVar42 + 1 + uVar33);
joined_r0x001390d0:
  if (cVar2 == '\0') {
    uVar9 = UFPC::Merge(*(uint *)(lVar18 + 8 + uVar33 * 4),*(uint *)(lVar26 + -8 + uVar33 * 4));
  }
  else {
    if (*(char *)(lVar41 + uVar33) == '\0') {
      uVar9 = *(uint *)(lVar18 + 8 + uVar33 * 4);
      if (*(char *)(lVar42 + uVar33) == '\0') {
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar33 * 4));
        *(uint *)(lVar26 + uVar33 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar26 + uVar33 * 4) = uVar9;
      }
      goto LAB_001383cc;
    }
LAB_001390e1:
    uVar9 = *(uint *)(lVar18 + 8 + uVar33 * 4);
  }
  *(uint *)(lVar26 + uVar33 * 4) = uVar9;
  goto LAB_001383cc;
code_r0x00137be0:
  if (*(char *)(lVar40 + 1 + lVar10) == '\0') goto LAB_001377e9;
LAB_00137c00:
  iVar30 = (int)uVar35;
  lVar10 = (long)iVar30;
  local_128 = uVar35;
  if (*(char *)(lVar10 + 1 + lVar41) != '\0') {
    if (*(char *)(lVar41 + lVar10) == '\0') {
      if (*(char *)(lVar41 + -1 + lVar10) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar18 + lVar10 * 4),*(uint *)(lVar26 + -8 + lVar10 * 4));
        *(uint *)(lVar26 + lVar10 * 4) = uVar9;
        uVar35 = uVar35 & 0xffffffff;
      }
      else {
        if (*(char *)(lVar42 + lVar10) == '\0') {
          uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + lVar10 * 4),*(uint *)(lVar18 + lVar10 * 4));
          uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
        }
        else {
          uVar9 = *(uint *)(lVar18 + lVar10 * 4);
          uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
        }
        uVar9 = UFPC::Merge(uVar9,uVar8);
        *(uint *)(lVar26 + lVar10 * 4) = uVar9;
      }
    }
    else {
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + lVar10 * 4),*(uint *)(lVar26 + -8 + lVar10 * 4));
      *(uint *)(lVar26 + lVar10 * 4) = uVar9;
LAB_00137c42:
      uVar35 = local_128 & 0xffffffff;
    }
    goto LAB_00139819;
  }
  if (*(char *)(lVar37 + 1 + lVar10) == '\0') {
    local_128 = (ulong)iVar30;
    if (*(char *)(lVar41 + -1 + local_128) != '\0') {
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + local_128 * 4),
                          *(uint *)(lVar26 + -8 + local_128 * 4));
      *(uint *)(lVar26 + local_128 * 4) = uVar9;
      goto LAB_0013910e;
    }
LAB_00137f8a:
    if (*(char *)(lVar41 + local_128) != '\0') goto code_r0x00137f96;
    *(undefined4 *)(lVar26 + local_128 * 4) = *(undefined4 *)(lVar26 + -8 + local_128 * 4);
    goto LAB_00137929;
  }
  if (*(char *)(lVar10 + 2 + lVar41) == '\0') {
    if (*(char *)(lVar41 + -1 + lVar10) != '\0') {
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + lVar10 * 4),*(uint *)(lVar26 + -8 + lVar10 * 4));
      *(uint *)(lVar26 + lVar10 * 4) = uVar9;
      goto LAB_001389d0;
    }
LAB_00137acc:
    if (*(char *)(lVar41 + lVar10) != '\0') {
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + lVar10 * 4),*(uint *)(lVar26 + -8 + lVar10 * 4));
      *(uint *)(lVar26 + lVar10 * 4) = uVar9;
      goto LAB_00138775;
    }
    *(undefined4 *)(lVar26 + lVar10 * 4) = *(undefined4 *)(lVar26 + -8 + lVar10 * 4);
    goto LAB_001381fa;
  }
  if (*(char *)(lVar41 + lVar10) == '\0') {
    if (*(char *)(lVar41 + -1 + lVar10) == '\0') {
      uVar9 = *(uint *)(lVar18 + 8 + lVar10 * 4);
      uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
      goto LAB_00139b07;
    }
    if (*(char *)(lVar42 + 1 + lVar10) == '\0') {
      uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + lVar10 * 4),*(uint *)(lVar18 + 8 + lVar10 * 4));
      uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
      goto LAB_00139b07;
    }
    if (*(char *)(lVar42 + lVar10) != '\0') goto LAB_00137d20;
    uVar9 = *(uint *)(lVar18 + -8 + lVar10 * 4);
  }
  else {
    if (*(char *)(lVar42 + 1 + lVar10) != '\0') {
LAB_00137d20:
      uVar9 = *(uint *)(lVar18 + 8 + lVar10 * 4);
      uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
      goto LAB_00137ffa;
    }
    uVar9 = *(uint *)(lVar18 + lVar10 * 4);
  }
  uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar18 + 8 + lVar10 * 4));
  uVar8 = *(uint *)(lVar26 + -8 + lVar10 * 4);
LAB_00137ffa:
  uVar9 = UFPC::Merge(uVar9,uVar8);
  *(uint *)(lVar26 + lVar10 * 4) = uVar9;
  goto LAB_001383cc;
code_r0x00137f96:
  uVar9 = UFPC::Merge(*(uint *)(lVar18 + local_128 * 4),*(uint *)(lVar26 + -8 + local_128 * 4));
  *(uint *)(lVar26 + local_128 * 4) = uVar9;
  goto LAB_00138090;
LAB_00139ae8:
  lVar10 = (long)(int)local_128;
  if (*(char *)(lVar42 + 1 + lVar10) == '\0') {
    uVar9 = *(uint *)(lVar18 + lVar10 * 4);
    uVar8 = *(uint *)(lVar18 + 8 + lVar10 * 4);
LAB_00139b07:
    uVar9 = UFPC::Merge(uVar9,uVar8);
  }
  else {
    uVar9 = *(uint *)(lVar18 + 8 + lVar10 * 4);
  }
  *(uint *)(lVar26 + lVar10 * 4) = uVar9;
  goto LAB_001383cc;
LAB_00139db9:
  if ((*(char *)(lVar42 + 1 + uVar33) == '\0') || (*(char *)(lVar42 + uVar33) == '\0')) {
    uVar9 = UFPC::Merge(*(uint *)(lVar18 + -8 + uVar33 * 4),*(uint *)(lVar18 + 8 + uVar33 * 4));
  }
  else {
    uVar9 = *(uint *)(lVar18 + 8 + uVar33 * 4);
  }
  *(uint *)(lVar26 + uVar33 * 4) = uVar9;
  goto LAB_001383cc;
LAB_00139441:
  uVar9 = UFPC::Merge(*(uint *)(lVar18 + uVar48 * 4),*(uint *)(lVar26 + lVar36 * 4));
  *(uint *)(lVar26 + uVar48 * 4) = uVar9;
  goto LAB_00139212;
LAB_00139389:
  uVar48 = (ulong)(int)uVar35;
  if (*(char *)((uVar48 - 2) + lVar41) != '\0') goto LAB_00139397;
LAB_00137df8:
  uVar9 = *(uint *)(lVar18 + uVar48 * 4);
LAB_00137dfb:
  uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar26 + -8 + uVar48 * 4));
  *(uint *)(lVar26 + uVar48 * 4) = uVar9;
  goto LAB_00139212;
code_r0x001398e6:
  *(undefined4 *)(lVar15 + lVar11 * 4) = *(undefined4 *)(lVar39 + lVar11 * 4);
  lVar45 = lVar45 + 0x200000000;
  lVar11 = lVar11 + 2;
  goto LAB_001398a4;
LAB_0013a6f1:
  uVar35 = (ulong)(iVar30 + iVar23 + 2);
  *(undefined4 *)(lVar16 + lVar21 * 4) = *(undefined4 *)(lVar37 + (lVar15 >> 0x1e));
LAB_0013a76a:
  iVar30 = (int)uVar35;
  lVar12 = (long)iVar30;
  lVar15 = lVar12 << 0x20;
  lVar16 = lVar46 + lVar12;
  lVar10 = lVar40 + lVar12 * 4;
  lVar11 = 0;
LAB_0013a798:
  lVar21 = lVar15 >> 0x20;
  if (lVar13 <= lVar12 + lVar11 + 2) {
    uVar35 = (ulong)(iVar30 + 2) + lVar11;
    if (iVar29 < (int)uVar35) {
      uVar48 = uVar35 & 0xffffffff;
      goto LAB_0013ac79;
    }
    uVar48 = lVar15 + 0x200000000 >> 0x20;
    if (*(char *)(lVar22 + uVar48) == '\0') {
      uVar48 = uVar35 & 0xffffffff;
LAB_0013ae21:
      lVar34 = (long)(int)uVar48;
      if (*(char *)(lVar34 + 1 + lVar22) == '\0') goto LAB_0013ae41;
      if (*(char *)(lVar42 + 1 + lVar34) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar9 = UFPC::length_ + 1;
        *(uint *)(lVar37 + lVar34 * 4) = UFPC::length_;
        UFPC::length_ = uVar9;
        goto LAB_0013b085;
      }
      uVar14 = *(undefined4 *)(lVar44 + lVar34 * 4);
      goto LAB_0013ac8c;
    }
    if (*(char *)(lVar42 + 3 + lVar21) == '\0') {
      uVar9 = *(uint *)(lVar37 + lVar21 * 4);
      goto LAB_0013affa;
    }
    if ((*(char *)(lVar26 + uVar48) != '\0') && (*(char *)(lVar42 + lVar21) != '\0'))
    goto LAB_0013ad43;
    uVar9 = *(uint *)(lVar44 + uVar48 * 4);
    uVar8 = *(uint *)(lVar37 + lVar21 * 4);
    goto LAB_0013af1b;
  }
  if (*(char *)(lVar28 + lVar12 + -1 + lVar11) == '\0') {
    uVar35 = (ulong)(iVar30 + (int)lVar11 + 2);
    goto LAB_0013a4f1;
  }
  lVar27 = lVar15 >> 0x1e;
  if (*(char *)(lVar16 + -1 + lVar11) != '\0') goto LAB_0013a7f8;
  if (*(char *)(lVar28 + lVar12 + lVar11) == '\0') {
    uVar35 = (ulong)(iVar30 + (int)lVar11 + 2);
    *(undefined4 *)(lVar10 + lVar11 * 4) = *(undefined4 *)(lVar37 + lVar27);
    goto LAB_0013a1ce;
  }
  if (*(char *)(lVar16 + lVar11) == '\0') {
    *(undefined4 *)(lVar10 + lVar11 * 4) = *(undefined4 *)(lVar10 + -8 + lVar11 * 4);
    lVar15 = lVar15 + 0x200000000;
    lVar11 = lVar11 + 2;
    goto LAB_0013a798;
  }
  uVar35 = (ulong)(iVar30 + 2) + lVar11;
  if ((*(char *)(lVar11 + lVar31 + lVar12) == '\0') ||
     (*(char *)(lVar11 + -1 + lVar31 + lVar12) == '\0')) {
    uVar9 = *(uint *)(lVar18 + lVar12 * 4 + lVar11 * 4);
    uVar8 = *(uint *)(lVar37 + lVar27);
  }
  else {
    if (*(char *)(lVar42 + lVar21) != '\0') {
      uVar48 = lVar15 + 0x200000000 >> 0x20;
LAB_0013a8a7:
      uVar9 = *(uint *)(lVar32 + uVar48 * 4);
      if (*(char *)(lVar41 + uVar48) == '\0') {
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar37 + -8 + uVar48 * 4));
        *(uint *)(lVar37 + uVar48 * 4) = uVar9;
      }
      else {
        *(uint *)(lVar37 + uVar48 * 4) = uVar9;
      }
      goto LAB_0013a572;
    }
    uVar9 = *(uint *)(lVar18 + lVar12 * 4 + lVar11 * 4);
    uVar8 = *(uint *)(lVar37 + lVar21 * 4);
  }
  uVar9 = UFPC::Merge(uVar9,uVar8);
  *(uint *)(lVar10 + lVar11 * 4) = uVar9;
  goto LAB_0013a572;
LAB_0013a7f8:
  uVar35 = (ulong)(iVar30 + 2) + lVar11;
  if (*(char *)(lVar11 + -1 + lVar31 + lVar12) == '\0') {
    uVar9 = *(uint *)(lVar18 + lVar12 * 4 + -8 + lVar11 * 4);
    uVar8 = *(uint *)(lVar37 + lVar27);
  }
  else {
    if (*(char *)(lVar42 + lVar21) != '\0') {
      uVar48 = lVar15 + 0x200000000 >> 0x20;
      lVar12 = lVar41;
      goto LAB_0013aaf1;
    }
    uVar9 = *(uint *)(lVar18 + lVar12 * 4 + -8 + lVar11 * 4);
    uVar8 = *(uint *)(lVar37 + lVar21 * 4);
  }
  uVar9 = UFPC::Merge(uVar9,uVar8);
  *(uint *)(lVar10 + lVar11 * 4) = uVar9;
LAB_0013a961:
  do {
    iVar30 = (int)uVar35;
    lVar15 = (long)iVar30;
    lVar10 = lVar18 + lVar15 * 4;
    lVar12 = lVar47 + 2 + lVar38 + lVar15;
    lVar21 = lVar15 << 0x20;
    lVar16 = lVar40 + lVar15 * 4;
    lVar11 = 0;
LAB_0013a99b:
    uVar48 = lVar15 + lVar11 + 2;
    iVar23 = (int)lVar11;
    if (lVar13 <= (long)uVar48) {
      uVar48 = lVar21 + 0x200000000 >> 0x20;
      lVar34 = lVar21 >> 0x20;
      if (iVar29 < iVar23 + iVar30 + 2) {
        if (*(char *)(lVar22 + uVar48) == '\0') goto LAB_0013b003;
        if (*(char *)(lVar22 + 1 + lVar34) != '\0') {
          uVar9 = *(uint *)(lVar37 + lVar34 * 4);
          goto LAB_0013affa;
        }
      }
      else {
        uVar35 = uVar48;
        if (*(char *)(lVar22 + uVar48) == '\0') goto LAB_0013afde;
        if (*(char *)(lVar22 + 1 + lVar34) != '\0') goto LAB_0013adc5;
        if (*(char *)(lVar42 + 3 + lVar34) != '\0') {
          if (*(char *)(lVar42 + uVar48) == '\0') goto LAB_0013af75;
          goto LAB_0013aff5;
        }
      }
      if (*(char *)(lVar42 + uVar48) != '\0') goto LAB_0013aff5;
      uVar9 = *(uint *)(lVar44 + (lVar21 >> 0x1e));
      goto LAB_0013affa;
    }
    if (*(char *)(lVar28 + lVar15 + -1 + lVar11) == '\0') {
      uVar35 = (ulong)(iVar30 + iVar23 + 2);
      goto LAB_0013a22b;
    }
    if (*(char *)(lVar28 + lVar15 + -2 + lVar11) != '\0') {
      uVar35 = (ulong)(iVar30 + iVar23 + 2);
LAB_0013aa27:
      lVar10 = (long)(int)uVar35;
      if (*(char *)(lVar10 + 1 + lVar42) == '\0') {
        if (*(char *)(lVar22 + 1 + lVar10) == '\0') {
          *(undefined4 *)(lVar37 + lVar10 * 4) = *(undefined4 *)(lVar37 + -8 + lVar10 * 4);
          goto LAB_0013a1ce;
        }
        if (*(char *)(lVar10 + 2 + lVar42) == '\0') {
          *(undefined4 *)(lVar37 + lVar10 * 4) = *(undefined4 *)(lVar37 + -8 + lVar10 * 4);
          goto LAB_0013a76a;
        }
        if (*(char *)(lVar26 + 1 + lVar10) == '\0') {
          uVar9 = *(uint *)(lVar44 + 8 + lVar10 * 4);
LAB_0013ab90:
          uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar37 + -8 + lVar10 * 4));
        }
        else {
          if (*(char *)(lVar42 + lVar10) == '\0') {
            uVar9 = *(uint *)(lVar44 + 8 + lVar10 * 4);
            if (*(char *)(lVar26 + lVar10) == '\0') goto LAB_0013ab90;
            *(uint *)(lVar37 + lVar10 * 4) = uVar9;
            goto LAB_0013a572;
          }
          uVar9 = *(uint *)(lVar44 + 8 + lVar10 * 4);
        }
        *(uint *)(lVar37 + lVar10 * 4) = uVar9;
        goto LAB_0013a572;
      }
      if (*(char *)(lVar42 + lVar10) == '\0') {
        uVar9 = *(uint *)(lVar44 + lVar10 * 4);
        if (*(char *)(lVar26 + lVar10) != '\0') {
          *(uint *)(lVar37 + lVar10 * 4) = uVar9;
          goto LAB_0013a961;
        }
        uVar9 = UFPC::Merge(uVar9,*(uint *)(lVar37 + -8 + lVar10 * 4));
      }
      else {
        uVar9 = *(uint *)(lVar44 + lVar10 * 4);
      }
      *(uint *)(lVar37 + lVar10 * 4) = uVar9;
      goto LAB_0013a961;
    }
    if (*(char *)(lVar12 + 1 + lVar11) == '\0') {
      uVar35 = (ulong)(iVar30 + 2) + lVar11;
      if (*(char *)(lVar28 + lVar15 + lVar11) == '\0') {
        if (*(char *)(lVar11 + lVar12) == '\0') {
          uVar14 = *(undefined4 *)(lVar10 + -0x10 + lVar11 * 4);
        }
        else {
          uVar14 = *(undefined4 *)(lVar10 + -8 + lVar11 * 4);
        }
        *(undefined4 *)(lVar16 + lVar11 * 4) = uVar14;
        goto LAB_0013a1ce;
      }
      if (*(char *)(lVar11 + 2 + lVar12) != '\0') {
        if (*(char *)(lVar11 + lVar12) != '\0') goto LAB_0013a26a;
        uVar48 = lVar21 + 0x200000000 >> 0x20;
LAB_0013abbe:
        if ((*(char *)(lVar26 + 1 + uVar48) == '\0') || (*(char *)(lVar26 + uVar48) == '\0')) {
          uVar9 = UFPC::Merge(*(uint *)(lVar44 + -8 + uVar48 * 4),*(uint *)(lVar44 + 8 + uVar48 * 4)
                             );
        }
        else {
          uVar9 = *(uint *)(lVar32 + uVar48 * 4);
        }
        *(uint *)(lVar37 + uVar48 * 4) = uVar9;
        goto LAB_0013a572;
      }
      if (*(char *)(lVar11 + lVar12) == '\0') {
        uVar9 = UFPC::length_;
        uVar8 = *(uint *)(lVar10 + -0x10 + lVar11 * 4);
        goto LAB_0013a46a;
      }
LAB_0013a292:
      *(undefined4 *)(lVar37 + uVar48 * 4) = *(undefined4 *)(lVar44 + uVar48 * 4);
      lVar10 = (long)(int)uVar35;
      uVar48 = lVar10 + 2;
      if (iVar29 <= (int)uVar48) {
        if (iVar29 < (int)uVar48) goto LAB_0013ac79;
        if (*(char *)(lVar22 + uVar48) != '\0') {
          if (*(char *)(lVar42 + 3 + lVar10) == '\0') {
LAB_0013b07c:
            uVar9 = *(uint *)(lVar37 + lVar10 * 4);
LAB_0013b080:
            *(uint *)(lVar37 + 8 + lVar10 * 4) = uVar9;
            goto LAB_0013b085;
          }
          if (*(char *)(lVar26 + uVar48) == '\0') {
            uVar9 = UFPC::Merge(*(uint *)(lVar44 + 8 + lVar10 * 4),*(uint *)(lVar37 + lVar10 * 4));
            *(uint *)(lVar37 + 8 + lVar10 * 4) = uVar9;
            goto LAB_0013b085;
          }
          break;
        }
        goto LAB_0013ae21;
      }
      uVar35 = uVar48;
      if (*(char *)(lVar22 + uVar48) == '\0') {
LAB_0013a4f1:
        do {
          iVar30 = (int)uVar35;
          uVar48 = (ulong)iVar30;
          if (*(char *)(uVar48 + 1 + lVar22) == '\0') goto LAB_0013a353;
          if (*(char *)(lVar42 + 1 + uVar48) != '\0') {
LAB_0013a508:
            do {
              *(undefined4 *)(lVar37 + uVar48 * 4) = *(undefined4 *)(lVar44 + uVar48 * 4);
              uVar35 = (long)(int)uVar35 + 2;
              if (iVar29 <= (int)uVar35) {
                uVar48 = uVar35;
                if (iVar29 < (int)uVar35) goto LAB_0013ac79;
                if (*(char *)(lVar22 + uVar35) != '\0') goto LAB_0013adc5;
                goto LAB_0013afde;
              }
              if (*(char *)(lVar22 + uVar35) != '\0') goto LAB_0013aa27;
LAB_0013a22b:
              while( true ) {
                iVar30 = (int)uVar35;
                uVar48 = (ulong)iVar30;
                if (*(char *)(uVar48 + 1 + lVar22) != '\0') break;
LAB_0013a353:
                uVar48 = (ulong)iVar30;
LAB_0013a356:
                *(undefined4 *)(lVar37 + uVar48 * 4) = 0;
                lVar10 = (long)iVar30;
                uVar48 = lVar10 + 2;
                uVar35 = uVar48;
                if (iVar29 <= (int)uVar48) {
                  if (iVar29 < (int)uVar48) {
                    if (*(char *)(lVar22 + uVar48) == '\0') goto LAB_0013ae8f;
LAB_0013b057:
                    if (*(char *)(lVar42 + uVar48) != '\0') goto LAB_0013b062;
                    if (*(char *)(lVar42 + 1 + lVar10) == '\0') {
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar9 = UFPC::length_ + 1;
                      *(uint *)(lVar37 + 8 + lVar10 * 4) = UFPC::length_;
                      UFPC::length_ = uVar9;
                      goto LAB_0013b085;
                    }
                    uVar14 = *(undefined4 *)(lVar44 + lVar10 * 4);
                  }
                  else {
                    if (*(char *)(lVar22 + uVar48) == '\0') goto LAB_0013afde;
                    if (*(char *)(lVar42 + 3 + lVar10) == '\0') goto LAB_0013b057;
                    if ((*(char *)(lVar42 + uVar48) == '\0') &&
                       (*(char *)(lVar42 + 1 + lVar10) != '\0')) goto LAB_0013af75;
LAB_0013b062:
                    uVar14 = *(undefined4 *)(lVar44 + 8 + lVar10 * 4);
                  }
                  *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = uVar14;
                  goto LAB_0013b085;
                }
                if (*(char *)(lVar22 + uVar48) != '\0') {
                  if (*(char *)(lVar10 + 3 + lVar42) != '\0') {
                    if ((*(char *)(lVar42 + uVar48) != '\0') ||
                       (lVar12 = lVar26, *(char *)(lVar34 + lVar10) == '\0')) goto LAB_0013a385;
                    goto LAB_0013aaf1;
                  }
                  if (*(char *)(lVar22 + 3 + lVar10) == '\0') {
                    if (*(char *)(lVar42 + uVar48) != '\0') goto LAB_0013a3f0;
                    if (*(char *)(lVar34 + lVar10) == '\0') goto LAB_0013a209;
                    *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = *(undefined4 *)(lVar44 + lVar10 * 4);
                    goto LAB_0013a1ce;
                  }
                  cVar2 = *(char *)(lVar10 + 2 + lVar42);
                  if (*(char *)(lVar10 + 4 + lVar42) != '\0') {
                    if (cVar2 != '\0') goto LAB_0013a26a;
                    if (*(char *)(lVar34 + lVar10) != '\0') goto LAB_0013abbe;
                    *(undefined4 *)(lVar37 + 8 + lVar10 * 4) =
                         *(undefined4 *)(lVar44 + 0x10 + lVar10 * 4);
                    goto LAB_0013a572;
                  }
                  if (cVar2 != '\0') goto LAB_0013a292;
                  if (*(char *)(lVar34 + lVar10) == '\0') {
                    UFPC::P_[UFPC::length_] = UFPC::length_;
                    uVar9 = UFPC::length_ + 1;
                    uVar8 = UFPC::length_;
                  }
                  else {
                    uVar9 = UFPC::length_;
                    uVar8 = *(uint *)(lVar44 + lVar10 * 4);
                  }
                  goto LAB_0013a46a;
                }
              }
            } while (*(char *)(lVar42 + 1 + uVar48) != '\0');
            goto LAB_0013a246;
          }
          uVar48 = (ulong)iVar30;
          if (*(char *)(uVar48 + 2 + lVar42) != '\0') goto LAB_0013a53e;
LAB_0013a552:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar9 = UFPC::length_ + 1;
          uVar8 = UFPC::length_;
LAB_0013a46a:
          UFPC::length_ = uVar9;
          *(uint *)(lVar37 + uVar48 * 4) = uVar8;
          lVar10 = (long)(int)uVar35;
          uVar35 = lVar10 + 2;
          if (iVar29 <= (int)uVar35) {
            uVar48 = uVar35;
            if (iVar29 < (int)uVar35) goto LAB_0013ac79;
            if (*(char *)(lVar22 + uVar35) == '\0') goto LAB_0013ae21;
            if (*(char *)(lVar42 + 3 + lVar10) == '\0') goto LAB_0013b07c;
            uVar9 = UFPC::Merge(*(uint *)(lVar44 + 8 + lVar10 * 4),*(uint *)(lVar37 + lVar10 * 4));
            goto LAB_0013b080;
          }
          if (*(char *)(lVar22 + uVar35) != '\0') {
            if (*(char *)(lVar10 + 3 + lVar42) != '\0') goto LAB_0013a48d;
            if (*(char *)(lVar22 + 3 + lVar10) == '\0') goto LAB_0013a4d2;
            if (*(char *)(lVar10 + 4 + lVar42) == '\0') goto LAB_0013a4e0;
            uVar9 = UFPC::Merge(*(uint *)(lVar44 + 0x10 + lVar10 * 4),*(uint *)(lVar37 + lVar10 * 4)
                               );
            *(uint *)(lVar37 + 8 + lVar10 * 4) = uVar9;
            goto LAB_0013a572;
          }
        } while( true );
      }
      if (*(char *)(lVar10 + 3 + lVar42) == '\0') {
        if (*(char *)(lVar22 + 3 + lVar10) == '\0') goto LAB_0013a4d2;
        if (*(char *)(lVar10 + 4 + lVar42) == '\0') goto LAB_0013a4e0;
        if ((*(char *)(lVar26 + 3 + lVar10) != '\0') && (*(char *)(lVar26 + uVar48) != '\0'))
        goto LAB_0013a8a7;
        uVar9 = UFPC::Merge(*(uint *)(lVar44 + 0x10 + lVar10 * 4),*(uint *)(lVar37 + lVar10 * 4));
        *(uint *)(lVar37 + 8 + lVar10 * 4) = uVar9;
        goto LAB_0013a572;
      }
      lVar12 = lVar41;
      if (*(char *)(lVar26 + uVar48) != '\0') goto LAB_0013aaf1;
LAB_0013a48d:
      uVar9 = UFPC::Merge(*(uint *)(lVar44 + 8 + lVar10 * 4),*(uint *)(lVar37 + lVar10 * 4));
      *(uint *)(lVar37 + 8 + lVar10 * 4) = uVar9;
    }
    else {
      if (*(char *)(lVar12 + lVar11) != '\0') goto code_r0x0013a9d3;
      uVar48 = lVar21 + 0x200000000 >> 0x20;
      lVar12 = lVar26;
      uVar35 = (ulong)(iVar30 + iVar23 + 2);
LAB_0013aaf1:
      if (*(char *)(lVar12 + uVar48) == '\0') {
        uVar9 = UFPC::Merge(*(uint *)(lVar44 + -8 + uVar48 * 4),*(uint *)(lVar44 + uVar48 * 4));
      }
      else {
        uVar9 = *(uint *)(lVar44 + uVar48 * 4);
      }
      *(uint *)(lVar37 + uVar48 * 4) = uVar9;
    }
  } while( true );
LAB_0013ad43:
  if (*(char *)(lVar26 + -1 + uVar48) == '\0') {
    uVar9 = *(uint *)(lVar44 + -8 + uVar48 * 4);
    uVar8 = *(uint *)(lVar44 + uVar48 * 4);
LAB_0013b2da:
    uVar9 = UFPC::Merge(uVar9,uVar8);
  }
  else {
    uVar9 = *(uint *)(lVar44 + uVar48 * 4);
  }
  *(uint *)(lVar37 + uVar48 * 4) = uVar9;
  goto LAB_0013b085;
LAB_0013adc5:
  if (*(char *)(lVar42 + 1 + uVar48) == '\0') {
    uVar9 = *(uint *)(lVar37 + -8 + uVar48 * 4);
    goto LAB_0013affa;
  }
  if (*(char *)(lVar42 + uVar48) != '\0') goto LAB_0013aff5;
  uVar9 = *(uint *)(lVar44 + uVar48 * 4);
  if (*(char *)(lVar26 + uVar48) == '\0') {
    uVar8 = *(uint *)(lVar37 + -8 + uVar48 * 4);
    goto LAB_0013b2da;
  }
  *(uint *)(lVar37 + uVar48 * 4) = uVar9;
  goto LAB_0013b085;
LAB_0013af75:
  if (*(char *)(lVar26 + uVar48) != '\0') goto LAB_0013aff5;
  uVar9 = *(uint *)(lVar44 + -8 + uVar48 * 4);
  uVar8 = *(uint *)(lVar44 + uVar48 * 4);
LAB_0013af1b:
  uVar9 = UFPC::Merge(uVar9,uVar8);
  goto LAB_0013affa;
LAB_0013a385:
  *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = *(undefined4 *)(lVar44 + 8 + lVar10 * 4);
  goto LAB_0013a961;
LAB_0013a53e:
  *(undefined4 *)(lVar37 + uVar48 * 4) = *(undefined4 *)(lVar44 + 8 + uVar48 * 4);
  goto LAB_0013a572;
LAB_0013ac79:
  lVar34 = (long)(int)uVar48;
  if (*(char *)(lVar22 + lVar34) == '\0') {
LAB_0013ae41:
    *(undefined4 *)(lVar37 + lVar34 * 4) = 0;
  }
  else {
    uVar14 = *(undefined4 *)(lVar37 + -8 + lVar34 * 4);
LAB_0013ac8c:
    *(undefined4 *)(lVar37 + lVar34 * 4) = uVar14;
  }
  goto LAB_0013b085;
LAB_0013a4d2:
  *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = *(undefined4 *)(lVar37 + lVar10 * 4);
  goto LAB_0013a1ce;
LAB_0013a4e0:
  *(undefined4 *)(lVar37 + 8 + lVar10 * 4) = *(undefined4 *)(lVar37 + lVar10 * 4);
  goto LAB_0013a76a;
code_r0x0013a9d3:
  *(undefined4 *)(lVar16 + lVar11 * 4) = *(undefined4 *)(lVar10 + -8 + lVar11 * 4);
  lVar11 = lVar11 + 2;
  lVar21 = lVar21 + 0x200000000;
  goto LAB_0013a99b;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}